

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  byte bVar56;
  byte bVar57;
  long lVar58;
  byte bVar59;
  byte bVar60;
  uint uVar61;
  ulong uVar62;
  int iVar63;
  byte bVar64;
  bool bVar65;
  long lVar66;
  bool bVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar143;
  uint uVar144;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  uint uVar145;
  uint uVar149;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar150;
  float fVar169;
  float fVar171;
  vint4 bi_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar162 [32];
  float fVar170;
  float fVar172;
  float fVar173;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar177;
  vint4 bi_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar191 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  float fVar197;
  float fVar198;
  float fVar226;
  float fVar227;
  vint4 bi;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar228;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar242 [32];
  undefined1 auVar236 [16];
  undefined1 auVar243 [32];
  undefined1 auVar241 [16];
  undefined1 auVar244 [32];
  vint4 ai_2;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar257;
  vint4 ai_1;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar265;
  undefined1 auVar264 [32];
  vint4 ai;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar275 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar276 [64];
  float fVar281;
  float fVar282;
  undefined1 auVar277 [16];
  float fVar283;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [64];
  float fVar287;
  undefined1 auVar286 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar297;
  float fVar298;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  Primitive *local_670;
  ulong local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  RTCHitN local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar293 [64];
  
  PVar2 = prim[1];
  uVar68 = (ulong)(byte)PVar2;
  lVar58 = uVar68 * 0x25;
  fVar265 = *(float *)(prim + lVar58 + 0x12);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar75 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + lVar58 + 6));
  auVar229._0_4_ = fVar265 * auVar75._0_4_;
  auVar229._4_4_ = fVar265 * auVar75._4_4_;
  auVar229._8_4_ = fVar265 * auVar75._8_4_;
  auVar229._12_4_ = fVar265 * auVar75._12_4_;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar151._0_4_ = fVar265 * auVar74._0_4_;
  auVar151._4_4_ = fVar265 * auVar74._4_4_;
  auVar151._8_4_ = fVar265 * auVar74._8_4_;
  auVar151._12_4_ = fVar265 * auVar74._12_4_;
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar68 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar251 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar251 = vcvtdq2ps_avx(auVar251);
  auVar258._4_4_ = auVar151._0_4_;
  auVar258._0_4_ = auVar151._0_4_;
  auVar258._8_4_ = auVar151._0_4_;
  auVar258._12_4_ = auVar151._0_4_;
  auVar80 = vshufps_avx(auVar151,auVar151,0x55);
  auVar81 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar265 = auVar81._0_4_;
  auVar199._0_4_ = fVar265 * auVar77._0_4_;
  fVar169 = auVar81._4_4_;
  auVar199._4_4_ = fVar169 * auVar77._4_4_;
  fVar171 = auVar81._8_4_;
  auVar199._8_4_ = fVar171 * auVar77._8_4_;
  fVar281 = auVar81._12_4_;
  auVar199._12_4_ = fVar281 * auVar77._12_4_;
  auVar178._0_4_ = auVar19._0_4_ * fVar265;
  auVar178._4_4_ = auVar19._4_4_ * fVar169;
  auVar178._8_4_ = auVar19._8_4_ * fVar171;
  auVar178._12_4_ = auVar19._12_4_ * fVar281;
  auVar152._0_4_ = auVar251._0_4_ * fVar265;
  auVar152._4_4_ = auVar251._4_4_ * fVar169;
  auVar152._8_4_ = auVar251._8_4_ * fVar171;
  auVar152._12_4_ = auVar251._12_4_ * fVar281;
  auVar81 = vfmadd231ps_fma(auVar199,auVar80,auVar74);
  auVar82 = vfmadd231ps_fma(auVar178,auVar80,auVar18);
  auVar80 = vfmadd231ps_fma(auVar152,auVar76,auVar80);
  auVar84 = vfmadd231ps_fma(auVar81,auVar258,auVar75);
  auVar82 = vfmadd231ps_fma(auVar82,auVar258,auVar78);
  auVar83 = vfmadd231ps_fma(auVar80,auVar79,auVar258);
  auVar295._4_4_ = auVar229._0_4_;
  auVar295._0_4_ = auVar229._0_4_;
  auVar295._8_4_ = auVar229._0_4_;
  auVar295._12_4_ = auVar229._0_4_;
  auVar80 = vshufps_avx(auVar229,auVar229,0x55);
  auVar81 = vshufps_avx(auVar229,auVar229,0xaa);
  fVar265 = auVar81._0_4_;
  auVar259._0_4_ = fVar265 * auVar77._0_4_;
  fVar169 = auVar81._4_4_;
  auVar259._4_4_ = fVar169 * auVar77._4_4_;
  fVar171 = auVar81._8_4_;
  auVar259._8_4_ = fVar171 * auVar77._8_4_;
  fVar281 = auVar81._12_4_;
  auVar259._12_4_ = fVar281 * auVar77._12_4_;
  auVar248._0_4_ = auVar19._0_4_ * fVar265;
  auVar248._4_4_ = auVar19._4_4_ * fVar169;
  auVar248._8_4_ = auVar19._8_4_ * fVar171;
  auVar248._12_4_ = auVar19._12_4_ * fVar281;
  auVar230._0_4_ = auVar251._0_4_ * fVar265;
  auVar230._4_4_ = auVar251._4_4_ * fVar169;
  auVar230._8_4_ = auVar251._8_4_ * fVar171;
  auVar230._12_4_ = auVar251._12_4_ * fVar281;
  auVar74 = vfmadd231ps_fma(auVar259,auVar80,auVar74);
  auVar77 = vfmadd231ps_fma(auVar248,auVar80,auVar18);
  auVar18 = vfmadd231ps_fma(auVar230,auVar80,auVar76);
  auVar284 = vfmadd231ps_fma(auVar74,auVar295,auVar75);
  auVar151 = vfmadd231ps_fma(auVar77,auVar295,auVar78);
  auVar277._8_4_ = 0x7fffffff;
  auVar277._0_8_ = 0x7fffffff7fffffff;
  auVar277._12_4_ = 0x7fffffff;
  auVar152 = vfmadd231ps_fma(auVar18,auVar295,auVar79);
  auVar75 = vandps_avx(auVar277,auVar84);
  auVar271._8_4_ = 0x219392ef;
  auVar271._0_8_ = 0x219392ef219392ef;
  auVar271._12_4_ = 0x219392ef;
  uVar62 = vcmpps_avx512vl(auVar75,auVar271,1);
  bVar65 = (bool)((byte)uVar62 & 1);
  auVar71._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar84._0_4_;
  bVar65 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar84._4_4_;
  bVar65 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar84._8_4_;
  bVar65 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar84._12_4_;
  auVar75 = vandps_avx(auVar277,auVar82);
  uVar62 = vcmpps_avx512vl(auVar75,auVar271,1);
  bVar65 = (bool)((byte)uVar62 & 1);
  auVar72._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar82._0_4_;
  bVar65 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar82._4_4_;
  bVar65 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar82._8_4_;
  bVar65 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar82._12_4_;
  auVar75 = vandps_avx(auVar277,auVar83);
  uVar62 = vcmpps_avx512vl(auVar75,auVar271,1);
  bVar65 = (bool)((byte)uVar62 & 1);
  auVar73._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar83._0_4_;
  bVar65 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar83._4_4_;
  bVar65 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar83._8_4_;
  bVar65 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar83._12_4_;
  auVar74 = vrcp14ps_avx512vl(auVar71);
  auVar272._8_4_ = 0x3f800000;
  auVar272._0_8_ = 0x3f8000003f800000;
  auVar272._12_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar71,auVar74,auVar272);
  auVar84 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar75 = vfnmadd213ps_fma(auVar72,auVar74,auVar272);
  auVar83 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar73);
  auVar75 = vfnmadd213ps_fma(auVar73,auVar74,auVar272);
  auVar85 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  fVar265 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar58 + 0x16)) *
            *(float *)(prim + lVar58 + 0x1a);
  auVar266._4_4_ = fVar265;
  auVar266._0_4_ = fVar265;
  auVar266._8_4_ = fVar265;
  auVar266._12_4_ = fVar265;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar74 = vpmovsxwd_avx(auVar74);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar78 = vsubps_avx(auVar74,auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar74 = vpmovsxwd_avx(auVar77);
  auVar77 = vfmadd213ps_fma(auVar78,auVar266,auVar75);
  auVar75 = vcvtdq2ps_avx(auVar74);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar74 = vpmovsxwd_avx(auVar78);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar78 = vfmadd213ps_fma(auVar74,auVar266,auVar75);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar75 = vpmovsxwd_avx(auVar18);
  auVar75 = vcvtdq2ps_avx(auVar75);
  uVar62 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar62 + 6);
  auVar74 = vpmovsxwd_avx(auVar19);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar18 = vfmadd213ps_fma(auVar74,auVar266,auVar75);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar62 + 6);
  auVar75 = vpmovsxwd_avx(auVar79);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar74 = vpmovsxwd_avx(auVar76);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar19 = vfmadd213ps_fma(auVar74,auVar266,auVar75);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar75 = vpmovsxwd_avx(auVar251);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar74 = vpmovsxwd_avx(auVar80);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar79 = vfmadd213ps_fma(auVar74,auVar266,auVar75);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar68) + 6);
  auVar75 = vpmovsxwd_avx(auVar81);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar74 = vpmovsxwd_avx(auVar82);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar74 = vfmadd213ps_fma(auVar74,auVar266,auVar75);
  auVar75 = vsubps_avx(auVar77,auVar284);
  auVar267._0_4_ = auVar84._0_4_ * auVar75._0_4_;
  auVar267._4_4_ = auVar84._4_4_ * auVar75._4_4_;
  auVar267._8_4_ = auVar84._8_4_ * auVar75._8_4_;
  auVar267._12_4_ = auVar84._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar78,auVar284);
  auVar200._0_4_ = auVar84._0_4_ * auVar75._0_4_;
  auVar200._4_4_ = auVar84._4_4_ * auVar75._4_4_;
  auVar200._8_4_ = auVar84._8_4_ * auVar75._8_4_;
  auVar200._12_4_ = auVar84._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar18,auVar151);
  auVar260._0_4_ = auVar83._0_4_ * auVar75._0_4_;
  auVar260._4_4_ = auVar83._4_4_ * auVar75._4_4_;
  auVar260._8_4_ = auVar83._8_4_ * auVar75._8_4_;
  auVar260._12_4_ = auVar83._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar19,auVar151);
  auVar179._0_4_ = auVar83._0_4_ * auVar75._0_4_;
  auVar179._4_4_ = auVar83._4_4_ * auVar75._4_4_;
  auVar179._8_4_ = auVar83._8_4_ * auVar75._8_4_;
  auVar179._12_4_ = auVar83._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar79,auVar152);
  auVar249._0_4_ = auVar85._0_4_ * auVar75._0_4_;
  auVar249._4_4_ = auVar85._4_4_ * auVar75._4_4_;
  auVar249._8_4_ = auVar85._8_4_ * auVar75._8_4_;
  auVar249._12_4_ = auVar85._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar74,auVar152);
  auVar153._0_4_ = auVar85._0_4_ * auVar75._0_4_;
  auVar153._4_4_ = auVar85._4_4_ * auVar75._4_4_;
  auVar153._8_4_ = auVar85._8_4_ * auVar75._8_4_;
  auVar153._12_4_ = auVar85._12_4_ * auVar75._12_4_;
  auVar75 = vpminsd_avx(auVar267,auVar200);
  auVar74 = vpminsd_avx(auVar260,auVar179);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar74 = vpminsd_avx(auVar249,auVar153);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar84._4_4_ = uVar177;
  auVar84._0_4_ = uVar177;
  auVar84._8_4_ = uVar177;
  auVar84._12_4_ = uVar177;
  auVar74 = vmaxps_avx512vl(auVar74,auVar84);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  local_520 = vmulps_avx512vl(auVar75,auVar83);
  auVar75 = vpmaxsd_avx(auVar267,auVar200);
  auVar74 = vpmaxsd_avx(auVar260,auVar179);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar74 = vpmaxsd_avx(auVar249,auVar153);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar85._4_4_ = uVar177;
  auVar85._0_4_ = uVar177;
  auVar85._8_4_ = uVar177;
  auVar85._12_4_ = uVar177;
  auVar74 = vminps_avx512vl(auVar74,auVar85);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar284._8_4_ = 0x3f800003;
  auVar284._0_8_ = 0x3f8000033f800003;
  auVar284._12_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar284);
  auVar74 = vpbroadcastd_avx512vl();
  uVar20 = vcmpps_avx512vl(local_520,auVar75,2);
  local_668 = vpcmpgtd_avx512vl(auVar74,_DAT_01f7fcf0);
  local_668 = ((byte)uVar20 & 0xf) & local_668;
  if ((char)local_668 == '\0') {
    return false;
  }
  local_500 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_670 = prim;
LAB_01ba7281:
  lVar58 = 0;
  for (uVar62 = local_668; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  uVar61 = *(uint *)(local_670 + 2);
  pGVar3 = (context->scene->geometries).items[uVar61].ptr;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_670 + lVar58 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar265 = (pGVar3->time_range).lower;
  fVar265 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar265) / ((pGVar3->time_range).upper - fVar265));
  auVar75 = vroundss_avx(ZEXT416((uint)fVar265),ZEXT416((uint)fVar265),9);
  auVar75 = vminss_avx(auVar75,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar75 = vmaxss_avx(ZEXT816(0) << 0x20,auVar75);
  fVar265 = fVar265 - auVar75._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar75._0_4_ * 0x38;
  lVar58 = *(long *)(_Var4 + 0x10 + lVar66);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar66);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar66);
  pfVar1 = (float *)(lVar5 + uVar62 * lVar6);
  auVar154._0_4_ = fVar265 * *pfVar1;
  auVar154._4_4_ = fVar265 * pfVar1[1];
  auVar154._8_4_ = fVar265 * pfVar1[2];
  auVar154._12_4_ = fVar265 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar62 + 1) * lVar6);
  auVar180._0_4_ = fVar265 * *pfVar1;
  auVar180._4_4_ = fVar265 * pfVar1[1];
  auVar180._8_4_ = fVar265 * pfVar1[2];
  auVar180._12_4_ = fVar265 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar62 + 2) * lVar6);
  auVar201._0_4_ = fVar265 * *pfVar1;
  auVar201._4_4_ = fVar265 * pfVar1[1];
  auVar201._8_4_ = fVar265 * pfVar1[2];
  auVar201._12_4_ = fVar265 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar62 + 3));
  auVar231._0_4_ = fVar265 * *pfVar1;
  auVar231._4_4_ = fVar265 * pfVar1[1];
  auVar231._8_4_ = fVar265 * pfVar1[2];
  auVar231._12_4_ = fVar265 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar66);
  fVar265 = 1.0 - fVar265;
  auVar250._4_4_ = fVar265;
  auVar250._0_4_ = fVar265;
  auVar250._8_4_ = fVar265;
  auVar250._12_4_ = fVar265;
  auVar77 = vfmadd231ps_fma(auVar154,auVar250,*(undefined1 (*) [16])(lVar5 + lVar58 * uVar62));
  auVar78 = vfmadd231ps_fma(auVar180,auVar250,*(undefined1 (*) [16])(lVar5 + lVar58 * (uVar62 + 1)))
  ;
  auVar18 = vfmadd231ps_fma(auVar201,auVar250,*(undefined1 (*) [16])(lVar5 + lVar58 * (uVar62 + 2)))
  ;
  auVar19 = vfmadd231ps_fma(auVar231,auVar250,*(undefined1 (*) [16])(lVar5 + lVar58 * (uVar62 + 3)))
  ;
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar74 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar289._4_4_ = uVar177;
  auVar289._0_4_ = uVar177;
  auVar289._8_4_ = uVar177;
  auVar289._12_4_ = uVar177;
  fStack_570 = (float)uVar177;
  _local_580 = auVar289;
  fStack_56c = (float)uVar177;
  fStack_568 = (float)uVar177;
  register0x0000151c = uVar177;
  auVar293 = ZEXT3264(_local_580);
  uVar177 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar294._4_4_ = uVar177;
  auVar294._0_4_ = uVar177;
  auVar294._8_4_ = uVar177;
  auVar294._12_4_ = uVar177;
  local_5a0._16_4_ = uVar177;
  local_5a0._0_16_ = auVar294;
  local_5a0._20_4_ = uVar177;
  local_5a0._24_4_ = uVar177;
  local_5a0._28_4_ = uVar177;
  auVar75 = vunpcklps_avx(auVar289,auVar294);
  fVar265 = *(float *)(ray + k * 4 + 0xc0);
  auVar296._4_4_ = fVar265;
  auVar296._0_4_ = fVar265;
  auVar296._8_4_ = fVar265;
  auVar296._12_4_ = fVar265;
  local_5c0._16_4_ = fVar265;
  local_5c0._0_16_ = auVar296;
  local_5c0._20_4_ = fVar265;
  local_5c0._24_4_ = fVar265;
  local_5c0._28_4_ = fVar265;
  local_7b0 = vinsertps_avx(auVar75,auVar296,0x28);
  auVar285 = ZEXT1664(local_7b0);
  auVar261._0_4_ = auVar77._0_4_ + auVar78._0_4_ + auVar18._0_4_ + auVar19._0_4_;
  auVar261._4_4_ = auVar77._4_4_ + auVar78._4_4_ + auVar18._4_4_ + auVar19._4_4_;
  auVar261._8_4_ = auVar77._8_4_ + auVar78._8_4_ + auVar18._8_4_ + auVar19._8_4_;
  auVar261._12_4_ = auVar77._12_4_ + auVar78._12_4_ + auVar18._12_4_ + auVar19._12_4_;
  auVar25._8_4_ = 0x3e800000;
  auVar25._0_8_ = 0x3e8000003e800000;
  auVar25._12_4_ = 0x3e800000;
  auVar75 = vmulps_avx512vl(auVar261,auVar25);
  auVar75 = vsubps_avx(auVar75,auVar74);
  auVar75 = vdpps_avx(auVar75,local_7b0,0x7f);
  fVar169 = *(float *)(ray + k * 4 + 0x60);
  auVar286 = ZEXT464((uint)fVar169);
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  auVar288 = ZEXT1664(local_7c0);
  local_4a0 = vpbroadcastd_avx512vl();
  auVar268._4_12_ = ZEXT812(0) << 0x20;
  auVar268._0_4_ = local_7c0._0_4_;
  auVar76 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar268);
  auVar79 = vfnmadd213ss_fma(auVar76,local_7c0,ZEXT416(0x40000000));
  fVar171 = auVar75._0_4_ * auVar76._0_4_ * auVar79._0_4_;
  auVar269._4_4_ = fVar171;
  auVar269._0_4_ = fVar171;
  auVar269._8_4_ = fVar171;
  auVar269._12_4_ = fVar171;
  auVar75 = vfmadd231ps_fma(auVar74,local_7b0,auVar269);
  auVar75 = vblendps_avx(auVar75,ZEXT816(0) << 0x40,8);
  auVar74 = vsubps_avx(auVar77,auVar75);
  auVar77 = vsubps_avx(auVar18,auVar75);
  auVar276 = ZEXT1664(auVar77);
  auVar78 = vsubps_avx(auVar78,auVar75);
  auVar280 = ZEXT1664(auVar78);
  auVar75 = vsubps_avx(auVar19,auVar75);
  auVar86 = vbroadcastss_avx512vl(auVar74);
  auVar98._8_4_ = 1;
  auVar98._0_8_ = 0x100000001;
  auVar98._12_4_ = 1;
  auVar98._16_4_ = 1;
  auVar98._20_4_ = 1;
  auVar98._24_4_ = 1;
  auVar98._28_4_ = 1;
  local_740 = ZEXT1632(auVar74);
  auVar87 = vpermps_avx512vl(auVar98,local_740);
  auVar99._8_4_ = 2;
  auVar99._0_8_ = 0x200000002;
  auVar99._12_4_ = 2;
  auVar99._16_4_ = 2;
  auVar99._20_4_ = 2;
  auVar99._24_4_ = 2;
  auVar99._28_4_ = 2;
  auVar88 = vpermps_avx512vl(auVar99,local_740);
  auVar102._8_4_ = 3;
  auVar102._0_8_ = 0x300000003;
  auVar102._12_4_ = 3;
  auVar102._16_4_ = 3;
  auVar102._20_4_ = 3;
  auVar102._24_4_ = 3;
  auVar102._28_4_ = 3;
  auVar89 = vpermps_avx512vl(auVar102,local_740);
  auVar90 = vbroadcastss_avx512vl(auVar78);
  local_780 = ZEXT1632(auVar78);
  auVar91 = vpermps_avx512vl(auVar98,local_780);
  auVar92 = vpermps_avx512vl(auVar99,local_780);
  auVar93 = vpermps_avx512vl(auVar102,local_780);
  auVar94 = vbroadcastss_avx512vl(auVar77);
  local_760 = ZEXT1632(auVar77);
  auVar95 = vpermps_avx512vl(auVar98,local_760);
  auVar96 = vpermps_avx512vl(auVar99,local_760);
  auVar97 = vpermps_avx512vl(auVar102,local_760);
  local_260 = vbroadcastss_avx512vl(auVar75);
  _local_7a0 = ZEXT1632(auVar75);
  local_280 = vpermps_avx2(auVar98,_local_7a0);
  local_240 = vpermps_avx512vl(auVar99,_local_7a0);
  local_2c0 = vpermps_avx2(auVar102,_local_7a0);
  auVar75 = vfmadd231ps_fma(ZEXT432((uint)(fVar265 * fVar265)),local_5a0,local_5a0);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),_local_580,_local_580);
  local_220._0_4_ = auVar75._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar101);
  local_6d0 = ZEXT416((uint)fVar171);
  local_2e0 = fVar169 - fVar171;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  uVar62 = 0;
  bVar65 = false;
  iVar63 = 1;
  local_4c0 = vpbroadcastd_avx512vl();
  auVar75 = vsqrtss_avx(local_7c0,local_7c0);
  auVar74 = vsqrtss_avx(local_7c0,local_7c0);
  auVar196 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_2a0 = local_240;
  fVar265 = 0.0;
  do {
    local_510 = auVar196._0_16_;
    auVar77 = vmovshdup_avx(local_510);
    auVar77 = vsubps_avx(auVar77,local_510);
    auVar162._0_4_ = auVar77._0_4_;
    fVar17 = auVar162._0_4_ * 0.04761905;
    uVar177 = auVar196._0_4_;
    auVar254._4_4_ = uVar177;
    auVar254._0_4_ = uVar177;
    auVar254._8_4_ = uVar177;
    auVar254._12_4_ = uVar177;
    auVar254._16_4_ = uVar177;
    auVar254._20_4_ = uVar177;
    auVar254._24_4_ = uVar177;
    auVar254._28_4_ = uVar177;
    auVar162._4_4_ = auVar162._0_4_;
    auVar162._8_4_ = auVar162._0_4_;
    auVar162._12_4_ = auVar162._0_4_;
    auVar162._16_4_ = auVar162._0_4_;
    auVar162._20_4_ = auVar162._0_4_;
    auVar162._24_4_ = auVar162._0_4_;
    auVar162._28_4_ = auVar162._0_4_;
    auVar77 = vfmadd231ps_fma(auVar254,auVar162,_DAT_01faff20);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar99 = vsubps_avx512vl(auVar98,ZEXT1632(auVar77));
    fVar281 = auVar99._0_4_;
    fVar283 = auVar99._4_4_;
    fVar246 = auVar99._8_4_;
    fVar297 = auVar99._12_4_;
    fVar298 = auVar99._16_4_;
    fVar198 = auVar99._20_4_;
    fVar16 = auVar99._24_4_;
    fVar150 = fVar281 * fVar281 * fVar281;
    fVar170 = fVar283 * fVar283 * fVar283;
    auVar103._4_4_ = fVar170;
    auVar103._0_4_ = fVar150;
    fVar172 = fVar246 * fVar246 * fVar246;
    auVar103._8_4_ = fVar172;
    fVar173 = fVar297 * fVar297 * fVar297;
    auVar103._12_4_ = fVar173;
    fVar174 = fVar298 * fVar298 * fVar298;
    auVar103._16_4_ = fVar174;
    fVar175 = fVar198 * fVar198 * fVar198;
    auVar103._20_4_ = fVar175;
    fVar176 = fVar16 * fVar16 * fVar16;
    auVar103._24_4_ = fVar176;
    auVar103._28_4_ = auVar162._0_4_;
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar101 = vmulps_avx512vl(auVar103,auVar100);
    fVar282 = auVar77._0_4_;
    fVar245 = auVar77._4_4_;
    fVar247 = auVar77._8_4_;
    fVar257 = auVar77._12_4_;
    fVar197 = fVar282 * fVar282 * fVar282;
    fVar226 = fVar245 * fVar245 * fVar245;
    fVar227 = fVar247 * fVar247 * fVar247;
    fVar228 = fVar257 * fVar257 * fVar257;
    auVar123._28_4_ = DAT_01faff20._28_4_;
    auVar123._0_28_ = ZEXT1628(CONCAT412(fVar228,CONCAT48(fVar227,CONCAT44(fVar226,fVar197))));
    auVar196._0_4_ = fVar282 * fVar281;
    auVar196._4_4_ = fVar245 * fVar283;
    auVar196._8_4_ = fVar247 * fVar246;
    auVar196._12_4_ = fVar257 * fVar297;
    auVar196._16_4_ = fVar298 * 0.0;
    auVar196._20_4_ = fVar198 * 0.0;
    auVar196._28_36_ = auVar285._28_36_;
    auVar196._24_4_ = fVar16 * 0.0;
    auVar102 = vmulps_avx512vl(auVar123,auVar100);
    fVar287 = auVar102._28_4_ + auVar162._0_4_;
    fVar265 = fVar287 + auVar288._28_4_ + fVar265;
    auVar108._4_4_ = fVar170 * 0.16666667;
    auVar108._0_4_ = fVar150 * 0.16666667;
    auVar108._8_4_ = fVar172 * 0.16666667;
    auVar108._12_4_ = fVar173 * 0.16666667;
    auVar108._16_4_ = fVar174 * 0.16666667;
    auVar108._20_4_ = fVar175 * 0.16666667;
    auVar108._24_4_ = fVar176 * 0.16666667;
    auVar108._28_4_ = fVar287;
    auVar105._4_4_ =
         (auVar196._4_4_ * fVar283 * 12.0 + auVar196._4_4_ * fVar245 * 6.0 +
         fVar226 + auVar101._4_4_) * 0.16666667;
    auVar105._0_4_ =
         (auVar196._0_4_ * fVar281 * 12.0 + auVar196._0_4_ * fVar282 * 6.0 +
         fVar197 + auVar101._0_4_) * 0.16666667;
    auVar105._8_4_ =
         (auVar196._8_4_ * fVar246 * 12.0 + auVar196._8_4_ * fVar247 * 6.0 +
         fVar227 + auVar101._8_4_) * 0.16666667;
    auVar105._12_4_ =
         (auVar196._12_4_ * fVar297 * 12.0 + auVar196._12_4_ * fVar257 * 6.0 +
         fVar228 + auVar101._12_4_) * 0.16666667;
    auVar105._16_4_ =
         (auVar196._16_4_ * fVar298 * 12.0 + auVar196._16_4_ * 0.0 * 6.0 + auVar101._16_4_ + 0.0) *
         0.16666667;
    auVar105._20_4_ =
         (auVar196._20_4_ * fVar198 * 12.0 + auVar196._20_4_ * 0.0 * 6.0 + auVar101._20_4_ + 0.0) *
         0.16666667;
    auVar105._24_4_ =
         (auVar196._24_4_ * fVar16 * 12.0 + auVar196._24_4_ * 0.0 * 6.0 + auVar101._24_4_ + 0.0) *
         0.16666667;
    auVar105._28_4_ = auVar288._28_4_;
    auVar106._4_4_ =
         (auVar102._4_4_ + fVar170 +
         auVar196._4_4_ * fVar245 * 12.0 + auVar196._4_4_ * fVar283 * 6.0) * 0.16666667;
    auVar106._0_4_ =
         (auVar102._0_4_ + fVar150 +
         auVar196._0_4_ * fVar282 * 12.0 + auVar196._0_4_ * fVar281 * 6.0) * 0.16666667;
    auVar106._8_4_ =
         (auVar102._8_4_ + fVar172 +
         auVar196._8_4_ * fVar247 * 12.0 + auVar196._8_4_ * fVar246 * 6.0) * 0.16666667;
    auVar106._12_4_ =
         (auVar102._12_4_ + fVar173 +
         auVar196._12_4_ * fVar257 * 12.0 + auVar196._12_4_ * fVar297 * 6.0) * 0.16666667;
    auVar106._16_4_ =
         (auVar102._16_4_ + fVar174 + auVar196._16_4_ * 0.0 * 12.0 + auVar196._16_4_ * fVar298 * 6.0
         ) * 0.16666667;
    auVar106._20_4_ =
         (auVar102._20_4_ + fVar175 + auVar196._20_4_ * 0.0 * 12.0 + auVar196._20_4_ * fVar198 * 6.0
         ) * 0.16666667;
    auVar106._24_4_ =
         (auVar102._24_4_ + fVar176 + auVar196._24_4_ * 0.0 * 12.0 + auVar196._24_4_ * fVar16 * 6.0)
         * 0.16666667;
    auVar106._28_4_ = auVar293._28_4_;
    fVar197 = fVar197 * 0.16666667;
    fVar226 = fVar226 * 0.16666667;
    fVar227 = fVar227 * 0.16666667;
    fVar228 = fVar228 * 0.16666667;
    auVar107._28_4_ = fVar265;
    auVar107._0_28_ = ZEXT1628(CONCAT412(fVar228,CONCAT48(fVar227,CONCAT44(fVar226,fVar197))));
    auVar102 = vmulps_avx512vl(local_260,auVar107);
    auVar110._4_4_ = local_280._4_4_ * fVar226;
    auVar110._0_4_ = local_280._0_4_ * fVar197;
    auVar110._8_4_ = local_280._8_4_ * fVar227;
    auVar110._12_4_ = local_280._12_4_ * fVar228;
    auVar110._16_4_ = local_280._16_4_ * 0.0;
    auVar110._20_4_ = local_280._20_4_ * 0.0;
    auVar110._24_4_ = local_280._24_4_ * 0.0;
    auVar110._28_4_ = auVar286._28_4_ + auVar293._28_4_ + DAT_01faff20._28_4_ + auVar101._28_4_;
    auVar101 = vmulps_avx512vl(local_2a0,auVar107);
    auVar111._4_4_ = local_2c0._4_4_ * fVar226;
    auVar111._0_4_ = local_2c0._0_4_ * fVar197;
    auVar111._8_4_ = local_2c0._8_4_ * fVar227;
    auVar111._12_4_ = local_2c0._12_4_ * fVar228;
    auVar111._16_4_ = local_2c0._16_4_ * 0.0;
    auVar111._20_4_ = local_2c0._20_4_ * 0.0;
    auVar111._24_4_ = local_2c0._24_4_ * 0.0;
    auVar111._28_4_ = fVar265;
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,auVar94);
    auVar103 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar95);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,auVar96);
    auVar104 = vfmadd231ps_avx512vl(auVar111,auVar97,auVar106);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,auVar90);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar91);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,auVar92);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar93,auVar105);
    auVar105 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar86);
    auVar106 = vfmadd231ps_avx512vl(auVar103,auVar108,auVar87);
    auVar107 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar88);
    auVar102 = vfmadd231ps_avx512vl(auVar104,auVar89,auVar108);
    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar103 = vxorps_avx512vl(auVar99,auVar108);
    auVar104 = vxorps_avx512vl(ZEXT1632(auVar77),auVar108);
    auVar124._0_4_ = auVar104._0_4_ * fVar282;
    auVar124._4_4_ = auVar104._4_4_ * fVar245;
    auVar124._8_4_ = auVar104._8_4_ * fVar247;
    auVar124._12_4_ = auVar104._12_4_ * fVar257;
    auVar124._16_4_ = auVar104._16_4_ * 0.0;
    auVar124._20_4_ = auVar104._20_4_ * 0.0;
    auVar124._24_4_ = auVar104._24_4_ * 0.0;
    auVar124._28_4_ = 0;
    auVar109 = vmulps_avx512vl(auVar196._0_32_,auVar100);
    auVar101 = vsubps_avx(auVar124,auVar109);
    auVar112._4_4_ = auVar103._4_4_ * fVar283 * 0.5;
    auVar112._0_4_ = auVar103._0_4_ * fVar281 * 0.5;
    auVar112._8_4_ = auVar103._8_4_ * fVar246 * 0.5;
    auVar112._12_4_ = auVar103._12_4_ * fVar297 * 0.5;
    auVar112._16_4_ = auVar103._16_4_ * fVar298 * 0.5;
    auVar112._20_4_ = auVar103._20_4_ * fVar198 * 0.5;
    auVar112._24_4_ = auVar103._24_4_ * fVar16 * 0.5;
    auVar112._28_4_ = auVar99._28_4_;
    auVar113._4_4_ = auVar101._4_4_ * 0.5;
    auVar113._0_4_ = auVar101._0_4_ * 0.5;
    auVar113._8_4_ = auVar101._8_4_ * 0.5;
    auVar113._12_4_ = auVar101._12_4_ * 0.5;
    auVar113._16_4_ = auVar101._16_4_ * 0.5;
    auVar113._20_4_ = auVar101._20_4_ * 0.5;
    auVar113._24_4_ = auVar101._24_4_ * 0.5;
    auVar113._28_4_ = auVar101._28_4_;
    auVar114._4_4_ = (auVar109._4_4_ + fVar283 * fVar283) * 0.5;
    auVar114._0_4_ = (auVar109._0_4_ + fVar281 * fVar281) * 0.5;
    auVar114._8_4_ = (auVar109._8_4_ + fVar246 * fVar246) * 0.5;
    auVar114._12_4_ = (auVar109._12_4_ + fVar297 * fVar297) * 0.5;
    auVar114._16_4_ = (auVar109._16_4_ + fVar298 * fVar298) * 0.5;
    auVar114._20_4_ = (auVar109._20_4_ + fVar198 * fVar198) * 0.5;
    auVar114._24_4_ = (auVar109._24_4_ + fVar16 * fVar16) * 0.5;
    auVar114._28_4_ = auVar109._28_4_ + auVar276._28_4_;
    fVar265 = fVar282 * fVar282 * 0.5;
    fVar281 = fVar245 * fVar245 * 0.5;
    fVar282 = fVar247 * fVar247 * 0.5;
    fVar283 = fVar257 * fVar257 * 0.5;
    auVar115._28_4_ = auVar280._28_4_;
    auVar115._0_28_ = ZEXT1628(CONCAT412(fVar283,CONCAT48(fVar282,CONCAT44(fVar281,fVar265))));
    auVar101 = vmulps_avx512vl(local_260,auVar115);
    auVar119._4_4_ = local_280._4_4_ * fVar281;
    auVar119._0_4_ = local_280._0_4_ * fVar265;
    auVar119._8_4_ = local_280._8_4_ * fVar282;
    auVar119._12_4_ = local_280._12_4_ * fVar283;
    auVar119._16_4_ = local_280._16_4_ * 0.0;
    auVar119._20_4_ = local_280._20_4_ * 0.0;
    auVar119._24_4_ = local_280._24_4_ * 0.0;
    auVar119._28_4_ = auVar104._28_4_;
    auVar99 = vmulps_avx512vl(local_2a0,auVar115);
    auVar120._4_4_ = fVar281 * local_2c0._4_4_;
    auVar120._0_4_ = fVar265 * local_2c0._0_4_;
    auVar120._8_4_ = fVar282 * local_2c0._8_4_;
    auVar120._12_4_ = fVar283 * local_2c0._12_4_;
    auVar120._16_4_ = local_2c0._16_4_ * 0.0;
    auVar120._20_4_ = local_2c0._20_4_ * 0.0;
    auVar120._24_4_ = local_2c0._24_4_ * 0.0;
    auVar120._28_4_ = auVar280._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar114,auVar94);
    auVar103 = vfmadd231ps_avx512vl(auVar119,auVar114,auVar95);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar114,auVar96);
    auVar77 = vfmadd231ps_fma(auVar120,auVar97,auVar114);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar113,auVar90);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,auVar91);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar113,auVar92);
    auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar93,auVar113);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar112,auVar86);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,auVar87);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,auVar88);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar89,auVar112);
    auVar128._4_4_ = auVar101._4_4_ * fVar17;
    auVar128._0_4_ = auVar101._0_4_ * fVar17;
    auVar128._8_4_ = auVar101._8_4_ * fVar17;
    auVar128._12_4_ = auVar101._12_4_ * fVar17;
    auVar128._16_4_ = auVar101._16_4_ * fVar17;
    auVar128._20_4_ = auVar101._20_4_ * fVar17;
    auVar128._24_4_ = auVar101._24_4_ * fVar17;
    auVar128._28_4_ = auVar97._28_4_;
    auVar293 = ZEXT3264(auVar128);
    auVar129._4_4_ = auVar103._4_4_ * fVar17;
    auVar129._0_4_ = auVar103._0_4_ * fVar17;
    auVar129._8_4_ = auVar103._8_4_ * fVar17;
    auVar129._12_4_ = auVar103._12_4_ * fVar17;
    auVar129._16_4_ = auVar103._16_4_ * fVar17;
    auVar129._20_4_ = auVar103._20_4_ * fVar17;
    auVar129._24_4_ = auVar103._24_4_ * fVar17;
    auVar129._28_4_ = 0x3e2aaaab;
    auVar130._4_4_ = auVar99._4_4_ * fVar17;
    auVar130._0_4_ = auVar99._0_4_ * fVar17;
    auVar130._8_4_ = auVar99._8_4_ * fVar17;
    auVar130._12_4_ = auVar99._12_4_ * fVar17;
    auVar130._16_4_ = auVar99._16_4_ * fVar17;
    auVar130._20_4_ = auVar99._20_4_ * fVar17;
    auVar130._24_4_ = auVar99._24_4_ * fVar17;
    auVar130._28_4_ = 0x40c00000;
    fVar265 = auVar104._0_4_ * fVar17;
    fVar281 = auVar104._4_4_ * fVar17;
    auVar121._4_4_ = fVar281;
    auVar121._0_4_ = fVar265;
    fVar282 = auVar104._8_4_ * fVar17;
    auVar121._8_4_ = fVar282;
    fVar283 = auVar104._12_4_ * fVar17;
    auVar121._12_4_ = fVar283;
    fVar245 = auVar104._16_4_ * fVar17;
    auVar121._16_4_ = fVar245;
    fVar246 = auVar104._20_4_ * fVar17;
    auVar121._20_4_ = fVar246;
    fVar247 = auVar104._24_4_ * fVar17;
    auVar121._24_4_ = fVar247;
    auVar121._28_4_ = fVar17;
    auVar77 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
    auVar110 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,ZEXT1632(auVar77));
    auVar285 = ZEXT3264(auVar110);
    auVar111 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,ZEXT1632(auVar77));
    auVar286 = ZEXT3264(auVar111);
    auVar99 = ZEXT1632(auVar77);
    auVar112 = vpermt2ps_avx512vl(auVar107,_DAT_01feed00,auVar99);
    auVar288 = ZEXT3264(auVar112);
    auVar125._0_4_ = fVar265 + auVar102._0_4_;
    auVar125._4_4_ = fVar281 + auVar102._4_4_;
    auVar125._8_4_ = fVar282 + auVar102._8_4_;
    auVar125._12_4_ = fVar283 + auVar102._12_4_;
    auVar125._16_4_ = fVar245 + auVar102._16_4_;
    auVar125._20_4_ = fVar246 + auVar102._20_4_;
    auVar125._24_4_ = fVar247 + auVar102._24_4_;
    auVar125._28_4_ = fVar17 + auVar102._28_4_;
    auVar101 = vmaxps_avx(auVar102,auVar125);
    auVar98 = vminps_avx(auVar102,auVar125);
    auVar109 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,auVar99);
    auVar113 = vpermt2ps_avx512vl(auVar128,_DAT_01feed00,auVar99);
    auVar280 = ZEXT3264(auVar113);
    auVar114 = vpermt2ps_avx512vl(auVar129,_DAT_01feed00,auVar99);
    auVar125 = ZEXT1632(auVar77);
    auVar115 = vpermt2ps_avx512vl(auVar130,_DAT_01feed00,auVar125);
    auVar99 = vpermt2ps_avx512vl(auVar121,_DAT_01feed00,auVar125);
    auVar116 = vsubps_avx512vl(auVar109,auVar99);
    auVar99 = vsubps_avx(auVar110,auVar105);
    auVar276 = ZEXT3264(auVar99);
    auVar102 = vsubps_avx(auVar111,auVar106);
    auVar103 = vsubps_avx(auVar112,auVar107);
    auVar104 = vmulps_avx512vl(auVar102,auVar130);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar129,auVar103);
    auVar117 = vmulps_avx512vl(auVar103,auVar128);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar130,auVar99);
    auVar118 = vmulps_avx512vl(auVar99,auVar129);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar128,auVar102);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar104,auVar104);
    auVar104 = vmulps_avx512vl(auVar103,auVar103);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar102);
    auVar118 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar99);
    auVar119 = vrcp14ps_avx512vl(auVar118);
    auVar104._8_4_ = 0x3f800000;
    auVar104._0_8_ = 0x3f8000003f800000;
    auVar104._12_4_ = 0x3f800000;
    auVar104._16_4_ = 0x3f800000;
    auVar104._20_4_ = 0x3f800000;
    auVar104._24_4_ = 0x3f800000;
    auVar104._28_4_ = 0x3f800000;
    auVar104 = vfnmadd213ps_avx512vl(auVar119,auVar118,auVar104);
    auVar104 = vfmadd132ps_avx512vl(auVar104,auVar119,auVar119);
    auVar117 = vmulps_avx512vl(auVar117,auVar104);
    auVar119 = vmulps_avx512vl(auVar102,auVar115);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar114,auVar103);
    auVar120 = vmulps_avx512vl(auVar103,auVar113);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar115,auVar99);
    auVar121 = vmulps_avx512vl(auVar99,auVar114);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar113,auVar102);
    auVar121 = vmulps_avx512vl(auVar121,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar104 = vmulps_avx512vl(auVar119,auVar104);
    auVar104 = vmaxps_avx512vl(auVar117,auVar104);
    auVar104 = vsqrtps_avx512vl(auVar104);
    auVar117 = vmaxps_avx512vl(auVar116,auVar109);
    auVar101 = vmaxps_avx512vl(auVar101,auVar117);
    auVar119 = vaddps_avx512vl(auVar104,auVar101);
    auVar101 = vminps_avx512vl(auVar116,auVar109);
    auVar101 = vminps_avx(auVar98,auVar101);
    auVar101 = vsubps_avx512vl(auVar101,auVar104);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar98 = vmulps_avx512vl(auVar119,auVar109);
    auVar116._8_4_ = 0x3f7ffffc;
    auVar116._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar116._12_4_ = 0x3f7ffffc;
    auVar116._16_4_ = 0x3f7ffffc;
    auVar116._20_4_ = 0x3f7ffffc;
    auVar116._24_4_ = 0x3f7ffffc;
    auVar116._28_4_ = 0x3f7ffffc;
    auVar101 = vmulps_avx512vl(auVar101,auVar116);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar104 = vrsqrt14ps_avx512vl(auVar118);
    auVar117._8_4_ = 0xbf000000;
    auVar117._0_8_ = 0xbf000000bf000000;
    auVar117._12_4_ = 0xbf000000;
    auVar117._16_4_ = 0xbf000000;
    auVar117._20_4_ = 0xbf000000;
    auVar117._24_4_ = 0xbf000000;
    auVar117._28_4_ = 0xbf000000;
    auVar109 = vmulps_avx512vl(auVar118,auVar117);
    fVar265 = auVar104._0_4_;
    fVar281 = auVar104._4_4_;
    fVar282 = auVar104._8_4_;
    fVar283 = auVar104._12_4_;
    fVar245 = auVar104._16_4_;
    fVar246 = auVar104._20_4_;
    fVar247 = auVar104._24_4_;
    auVar122._4_4_ = fVar281 * fVar281 * fVar281 * auVar109._4_4_;
    auVar122._0_4_ = fVar265 * fVar265 * fVar265 * auVar109._0_4_;
    auVar122._8_4_ = fVar282 * fVar282 * fVar282 * auVar109._8_4_;
    auVar122._12_4_ = fVar283 * fVar283 * fVar283 * auVar109._12_4_;
    auVar122._16_4_ = fVar245 * fVar245 * fVar245 * auVar109._16_4_;
    auVar122._20_4_ = fVar246 * fVar246 * fVar246 * auVar109._20_4_;
    auVar122._24_4_ = fVar247 * fVar247 * fVar247 * auVar109._24_4_;
    auVar122._28_4_ = auVar119._28_4_;
    auVar118._8_4_ = 0x3fc00000;
    auVar118._0_8_ = 0x3fc000003fc00000;
    auVar118._12_4_ = 0x3fc00000;
    auVar118._16_4_ = 0x3fc00000;
    auVar118._20_4_ = 0x3fc00000;
    auVar118._24_4_ = 0x3fc00000;
    auVar118._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_avx512vl(auVar122,auVar104,auVar118);
    auVar109 = vmulps_avx512vl(auVar99,auVar104);
    auVar116 = vmulps_avx512vl(auVar102,auVar104);
    auVar117 = vmulps_avx512vl(auVar103,auVar104);
    auVar118 = vsubps_avx512vl(auVar125,auVar105);
    auVar119 = vsubps_avx512vl(auVar125,auVar106);
    auVar120 = vsubps_avx512vl(auVar125,auVar107);
    auVar121 = vmulps_avx512vl(local_5c0,auVar120);
    auVar121 = vfmadd231ps_avx512vl(auVar121,local_5a0,auVar119);
    auVar121 = vfmadd231ps_avx512vl(auVar121,_local_580,auVar118);
    auVar122 = vmulps_avx512vl(auVar120,auVar120);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar119,auVar119);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar118,auVar118);
    auVar123 = vmulps_avx512vl(local_5c0,auVar117);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar116,local_5a0);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar109,_local_580);
    auVar117 = vmulps_avx512vl(auVar120,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar119,auVar116);
    auVar109 = vfmadd231ps_avx512vl(auVar116,auVar118,auVar109);
    auVar116 = vmulps_avx512vl(auVar123,auVar123);
    auVar117 = vsubps_avx512vl(local_220,auVar116);
    auVar124 = vmulps_avx512vl(auVar123,auVar109);
    auVar121 = vsubps_avx512vl(auVar121,auVar124);
    auVar121 = vaddps_avx512vl(auVar121,auVar121);
    auVar124 = vmulps_avx512vl(auVar109,auVar109);
    local_7e0 = vsubps_avx512vl(auVar122,auVar124);
    auVar98 = vsubps_avx512vl(local_7e0,auVar98);
    local_720 = vmulps_avx512vl(auVar121,auVar121);
    auVar122 = vmulps_avx512vl(auVar117,auVar100);
    auVar124 = vmulps_avx512vl(auVar122,auVar98);
    auVar124 = vsubps_avx512vl(local_720,auVar124);
    auVar77 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
    uVar68 = vcmpps_avx512vl(auVar124,auVar125,5);
    bVar55 = (byte)uVar68;
    if (bVar55 != 0) {
      auVar124 = vsqrtps_avx512vl(auVar124);
      auVar125 = vaddps_avx512vl(auVar117,auVar117);
      _local_600 = vrcp14ps_avx512vl(auVar125);
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = 0x3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar100._16_4_ = 0x3f800000;
      auVar100._20_4_ = 0x3f800000;
      auVar100._24_4_ = 0x3f800000;
      auVar100._28_4_ = 0x3f800000;
      auVar100 = vfnmadd213ps_avx512vl(_local_600,auVar125,auVar100);
      auVar100 = vfmadd132ps_avx512vl(auVar100,_local_600,_local_600);
      local_620 = vxorps_avx512vl(auVar121,auVar108);
      auVar108 = vsubps_avx512vl(local_620,auVar124);
      auVar108 = vmulps_avx512vl(auVar108,auVar100);
      auVar124 = vsubps_avx512vl(auVar124,auVar121);
      local_5e0 = vmulps_avx512vl(auVar124,auVar100);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar124 = vblendmps_avx512vl(auVar100,auVar108);
      auVar126._0_4_ =
           (uint)(bVar55 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar100._0_4_;
      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar67 * auVar124._4_4_ | (uint)!bVar67 * auVar100._4_4_;
      bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar67 * auVar124._8_4_ | (uint)!bVar67 * auVar100._8_4_;
      bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar67 * auVar124._12_4_ | (uint)!bVar67 * auVar100._12_4_;
      bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar67 * auVar124._16_4_ | (uint)!bVar67 * auVar100._16_4_;
      bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar67 * auVar124._20_4_ | (uint)!bVar67 * auVar100._20_4_;
      bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar67 * auVar124._24_4_ | (uint)!bVar67 * auVar100._24_4_;
      bVar67 = SUB81(uVar68 >> 7,0);
      auVar126._28_4_ = (uint)bVar67 * auVar124._28_4_ | (uint)!bVar67 * auVar100._28_4_;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar124 = vblendmps_avx512vl(auVar100,local_5e0);
      auVar127._0_4_ =
           (uint)(bVar55 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar100._0_4_;
      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar67 * auVar124._4_4_ | (uint)!bVar67 * auVar100._4_4_;
      bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar67 * auVar124._8_4_ | (uint)!bVar67 * auVar100._8_4_;
      bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar67 * auVar124._12_4_ | (uint)!bVar67 * auVar100._12_4_;
      bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar67 * auVar124._16_4_ | (uint)!bVar67 * auVar100._16_4_;
      bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar67 * auVar124._20_4_ | (uint)!bVar67 * auVar100._20_4_;
      bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar67 * auVar124._24_4_ | (uint)!bVar67 * auVar100._24_4_;
      bVar67 = SUB81(uVar68 >> 7,0);
      auVar127._28_4_ = (uint)bVar67 * auVar124._28_4_ | (uint)!bVar67 * auVar100._28_4_;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar116,auVar100);
      local_640 = vmaxps_avx512vl(local_240,auVar100);
      auVar242._8_4_ = 0x36000000;
      auVar242._0_8_ = 0x3600000036000000;
      auVar242._12_4_ = 0x36000000;
      auVar242._16_4_ = 0x36000000;
      auVar242._20_4_ = 0x36000000;
      auVar242._24_4_ = 0x36000000;
      auVar242._28_4_ = 0x36000000;
      local_660 = vmulps_avx512vl(local_640,auVar242);
      vandps_avx512vl(auVar117,auVar100);
      uVar21 = vcmpps_avx512vl(local_660,local_660,1);
      uVar68 = uVar68 & uVar21;
      bVar59 = (byte)uVar68;
      if (bVar59 != 0) {
        uVar21 = vcmpps_avx512vl(auVar98,ZEXT1632(auVar77),2);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar117 = vblendmps_avx512vl(auVar98,auVar116);
        bVar60 = (byte)uVar21;
        uVar70 = (uint)(bVar60 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar60 & 1) * local_660._0_4_;
        bVar67 = (bool)((byte)(uVar21 >> 1) & 1);
        uVar69 = (uint)bVar67 * auVar117._4_4_ | (uint)!bVar67 * local_660._4_4_;
        bVar67 = (bool)((byte)(uVar21 >> 2) & 1);
        uVar143 = (uint)bVar67 * auVar117._8_4_ | (uint)!bVar67 * local_660._8_4_;
        bVar67 = (bool)((byte)(uVar21 >> 3) & 1);
        uVar144 = (uint)bVar67 * auVar117._12_4_ | (uint)!bVar67 * local_660._12_4_;
        bVar67 = (bool)((byte)(uVar21 >> 4) & 1);
        uVar145 = (uint)bVar67 * auVar117._16_4_ | (uint)!bVar67 * local_660._16_4_;
        bVar67 = (bool)((byte)(uVar21 >> 5) & 1);
        uVar146 = (uint)bVar67 * auVar117._20_4_ | (uint)!bVar67 * local_660._20_4_;
        bVar67 = (bool)((byte)(uVar21 >> 6) & 1);
        uVar147 = (uint)bVar67 * auVar117._24_4_ | (uint)!bVar67 * local_660._24_4_;
        bVar67 = SUB81(uVar21 >> 7,0);
        uVar148 = (uint)bVar67 * auVar117._28_4_ | (uint)!bVar67 * local_660._28_4_;
        auVar126._0_4_ = (bVar59 & 1) * uVar70 | !(bool)(bVar59 & 1) * auVar126._0_4_;
        bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar126._4_4_ = bVar67 * uVar69 | !bVar67 * auVar126._4_4_;
        bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar126._8_4_ = bVar67 * uVar143 | !bVar67 * auVar126._8_4_;
        bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar126._12_4_ = bVar67 * uVar144 | !bVar67 * auVar126._12_4_;
        bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar126._16_4_ = bVar67 * uVar145 | !bVar67 * auVar126._16_4_;
        bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar126._20_4_ = bVar67 * uVar146 | !bVar67 * auVar126._20_4_;
        bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar126._24_4_ = bVar67 * uVar147 | !bVar67 * auVar126._24_4_;
        bVar67 = SUB81(uVar68 >> 7,0);
        auVar126._28_4_ = bVar67 * uVar148 | !bVar67 * auVar126._28_4_;
        auVar98 = vblendmps_avx512vl(auVar116,auVar98);
        bVar67 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar21 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
        bVar14 = SUB81(uVar21 >> 7,0);
        auVar127._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar60 & 1) * auVar98._0_4_ | !(bool)(bVar60 & 1) * uVar70) |
             !(bool)(bVar59 & 1) * auVar127._0_4_;
        bVar8 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar127._4_4_ =
             (uint)bVar8 * ((uint)bVar67 * auVar98._4_4_ | !bVar67 * uVar69) |
             !bVar8 * auVar127._4_4_;
        bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar127._8_4_ =
             (uint)bVar67 * ((uint)bVar9 * auVar98._8_4_ | !bVar9 * uVar143) |
             !bVar67 * auVar127._8_4_;
        bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar127._12_4_ =
             (uint)bVar67 * ((uint)bVar10 * auVar98._12_4_ | !bVar10 * uVar144) |
             !bVar67 * auVar127._12_4_;
        bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar127._16_4_ =
             (uint)bVar67 * ((uint)bVar11 * auVar98._16_4_ | !bVar11 * uVar145) |
             !bVar67 * auVar127._16_4_;
        bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar127._20_4_ =
             (uint)bVar67 * ((uint)bVar12 * auVar98._20_4_ | !bVar12 * uVar146) |
             !bVar67 * auVar127._20_4_;
        bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar127._24_4_ =
             (uint)bVar67 * ((uint)bVar13 * auVar98._24_4_ | !bVar13 * uVar147) |
             !bVar67 * auVar127._24_4_;
        bVar67 = SUB81(uVar68 >> 7,0);
        auVar127._28_4_ =
             (uint)bVar67 * ((uint)bVar14 * auVar98._28_4_ | !bVar14 * uVar148) |
             !bVar67 * auVar127._28_4_;
        bVar55 = (~bVar59 | bVar60) & bVar55;
      }
      if ((bVar55 & 0x7f) != 0) {
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar116 = vxorps_avx512vl(auVar115,auVar98);
        auVar117 = vxorps_avx512vl(auVar113,auVar98);
        uVar70 = *(uint *)(ray + k * 4 + 0x100);
        auVar113 = vxorps_avx512vl(auVar114,auVar98);
        auVar77 = vsubss_avx512f(ZEXT416(uVar70),ZEXT416((uint)local_6d0._0_4_));
        auVar114 = vbroadcastss_avx512vl(auVar77);
        auVar114 = vminps_avx512vl(auVar114,auVar127);
        auVar54._4_4_ = fStack_2dc;
        auVar54._0_4_ = local_2e0;
        auVar54._8_4_ = fStack_2d8;
        auVar54._12_4_ = fStack_2d4;
        auVar54._16_4_ = fStack_2d0;
        auVar54._20_4_ = fStack_2cc;
        auVar54._24_4_ = fStack_2c8;
        auVar54._28_4_ = fStack_2c4;
        auVar115 = vmaxps_avx512vl(auVar54,auVar126);
        auVar120 = vmulps_avx512vl(auVar130,auVar120);
        auVar119 = vfmadd213ps_avx512vl(auVar119,auVar129,auVar120);
        auVar77 = vfmadd213ps_fma(auVar118,auVar128,auVar119);
        auVar118 = vmulps_avx512vl(local_5c0,auVar130);
        auVar118 = vfmadd231ps_avx512vl(auVar118,local_5a0,auVar129);
        auVar78 = vfmadd231ps_fma(auVar118,_local_580,auVar128);
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar78),auVar118);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar20 = vcmpps_avx512vl(auVar118,auVar119,1);
        auVar120 = vxorps_avx512vl(ZEXT1632(auVar77),auVar98);
        auVar128 = vrcp14ps_avx512vl(ZEXT1632(auVar78));
        auVar242 = ZEXT1632(auVar78);
        auVar129 = vxorps_avx512vl(auVar242,auVar98);
        auVar130 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar100 = vfnmadd213ps_avx512vl(auVar128,auVar242,auVar130);
        auVar77 = vfmadd132ps_fma(auVar100,auVar128,auVar128);
        fVar265 = auVar77._0_4_ * auVar120._0_4_;
        fVar281 = auVar77._4_4_ * auVar120._4_4_;
        auVar37._4_4_ = fVar281;
        auVar37._0_4_ = fVar265;
        fVar282 = auVar77._8_4_ * auVar120._8_4_;
        auVar37._8_4_ = fVar282;
        fVar283 = auVar77._12_4_ * auVar120._12_4_;
        auVar37._12_4_ = fVar283;
        fVar245 = auVar120._16_4_ * 0.0;
        auVar37._16_4_ = fVar245;
        fVar246 = auVar120._20_4_ * 0.0;
        auVar37._20_4_ = fVar246;
        fVar247 = auVar120._24_4_ * 0.0;
        auVar37._24_4_ = fVar247;
        auVar37._28_4_ = auVar120._28_4_;
        uVar22 = vcmpps_avx512vl(auVar242,auVar129,1);
        bVar59 = (byte)uVar20 | (byte)uVar22;
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar124 = vblendmps_avx512vl(auVar37,auVar100);
        auVar131._0_4_ =
             (uint)(bVar59 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar128._0_4_;
        bVar67 = (bool)(bVar59 >> 1 & 1);
        auVar131._4_4_ = (uint)bVar67 * auVar124._4_4_ | (uint)!bVar67 * auVar128._4_4_;
        bVar67 = (bool)(bVar59 >> 2 & 1);
        auVar131._8_4_ = (uint)bVar67 * auVar124._8_4_ | (uint)!bVar67 * auVar128._8_4_;
        bVar67 = (bool)(bVar59 >> 3 & 1);
        auVar131._12_4_ = (uint)bVar67 * auVar124._12_4_ | (uint)!bVar67 * auVar128._12_4_;
        bVar67 = (bool)(bVar59 >> 4 & 1);
        auVar131._16_4_ = (uint)bVar67 * auVar124._16_4_ | (uint)!bVar67 * auVar128._16_4_;
        bVar67 = (bool)(bVar59 >> 5 & 1);
        auVar131._20_4_ = (uint)bVar67 * auVar124._20_4_ | (uint)!bVar67 * auVar128._20_4_;
        bVar67 = (bool)(bVar59 >> 6 & 1);
        auVar131._24_4_ = (uint)bVar67 * auVar124._24_4_ | (uint)!bVar67 * auVar128._24_4_;
        auVar131._28_4_ =
             (uint)(bVar59 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar128._28_4_;
        auVar128 = vmaxps_avx512vl(auVar115,auVar131);
        auVar293 = ZEXT3264(auVar128);
        uVar22 = vcmpps_avx512vl(auVar242,auVar129,6);
        bVar59 = (byte)uVar20 | (byte)uVar22;
        auVar132._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar265;
        bVar67 = (bool)(bVar59 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar281;
        bVar67 = (bool)(bVar59 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar282;
        bVar67 = (bool)(bVar59 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar283;
        bVar67 = (bool)(bVar59 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar245;
        bVar67 = (bool)(bVar59 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar246;
        bVar67 = (bool)(bVar59 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar247;
        auVar132._28_4_ =
             (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar120._28_4_;
        auVar120 = vminps_avx512vl(auVar114,auVar132);
        auVar77 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
        auVar110 = vsubps_avx512vl(ZEXT1632(auVar77),auVar110);
        auVar111 = vsubps_avx512vl(ZEXT1632(auVar77),auVar111);
        auVar115 = ZEXT1632(auVar77);
        auVar112 = vsubps_avx512vl(auVar115,auVar112);
        auVar112 = vmulps_avx512vl(auVar112,auVar116);
        auVar111 = vfmadd231ps_avx512vl(auVar112,auVar113,auVar111);
        auVar110 = vfmadd231ps_avx512vl(auVar111,auVar117,auVar110);
        auVar116 = vmulps_avx512vl(local_5c0,auVar116);
        auVar116 = vfmadd231ps_avx512vl(auVar116,local_5a0,auVar113);
        auVar116 = vfmadd231ps_avx512vl(auVar116,_local_580,auVar117);
        vandps_avx512vl(auVar116,auVar118);
        uVar20 = vcmpps_avx512vl(auVar116,auVar119,1);
        auVar117 = vxorps_avx512vl(auVar110,auVar98);
        auVar118 = vrcp14ps_avx512vl(auVar116);
        auVar98 = vxorps_avx512vl(auVar116,auVar98);
        auVar288 = ZEXT3264(auVar98);
        auVar110 = vfnmadd213ps_avx512vl(auVar118,auVar116,auVar130);
        auVar77 = vfmadd132ps_fma(auVar110,auVar118,auVar118);
        fVar265 = auVar77._0_4_ * auVar117._0_4_;
        fVar281 = auVar77._4_4_ * auVar117._4_4_;
        auVar38._4_4_ = fVar281;
        auVar38._0_4_ = fVar265;
        fVar282 = auVar77._8_4_ * auVar117._8_4_;
        auVar38._8_4_ = fVar282;
        fVar283 = auVar77._12_4_ * auVar117._12_4_;
        auVar38._12_4_ = fVar283;
        fVar245 = auVar117._16_4_ * 0.0;
        auVar38._16_4_ = fVar245;
        fVar246 = auVar117._20_4_ * 0.0;
        auVar38._20_4_ = fVar246;
        fVar247 = auVar117._24_4_ * 0.0;
        auVar38._24_4_ = fVar247;
        auVar38._28_4_ = auVar117._28_4_;
        uVar22 = vcmpps_avx512vl(auVar116,auVar98,1);
        bVar59 = (byte)uVar20 | (byte)uVar22;
        auVar110 = vblendmps_avx512vl(auVar38,auVar100);
        auVar133._0_4_ =
             (uint)(bVar59 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar118._0_4_;
        bVar67 = (bool)(bVar59 >> 1 & 1);
        auVar133._4_4_ = (uint)bVar67 * auVar110._4_4_ | (uint)!bVar67 * auVar118._4_4_;
        bVar67 = (bool)(bVar59 >> 2 & 1);
        auVar133._8_4_ = (uint)bVar67 * auVar110._8_4_ | (uint)!bVar67 * auVar118._8_4_;
        bVar67 = (bool)(bVar59 >> 3 & 1);
        auVar133._12_4_ = (uint)bVar67 * auVar110._12_4_ | (uint)!bVar67 * auVar118._12_4_;
        bVar67 = (bool)(bVar59 >> 4 & 1);
        auVar133._16_4_ = (uint)bVar67 * auVar110._16_4_ | (uint)!bVar67 * auVar118._16_4_;
        bVar67 = (bool)(bVar59 >> 5 & 1);
        auVar133._20_4_ = (uint)bVar67 * auVar110._20_4_ | (uint)!bVar67 * auVar118._20_4_;
        bVar67 = (bool)(bVar59 >> 6 & 1);
        auVar133._24_4_ = (uint)bVar67 * auVar110._24_4_ | (uint)!bVar67 * auVar118._24_4_;
        auVar133._28_4_ =
             (uint)(bVar59 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar118._28_4_;
        auVar286 = ZEXT3264(auVar133);
        _local_800 = vmaxps_avx(auVar128,auVar133);
        auVar280 = ZEXT3264(_local_800);
        uVar22 = vcmpps_avx512vl(auVar116,auVar98,6);
        bVar59 = (byte)uVar20 | (byte)uVar22;
        auVar134._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar265;
        bVar67 = (bool)(bVar59 >> 1 & 1);
        auVar134._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar281;
        bVar67 = (bool)(bVar59 >> 2 & 1);
        auVar134._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar282;
        bVar67 = (bool)(bVar59 >> 3 & 1);
        auVar134._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar283;
        bVar67 = (bool)(bVar59 >> 4 & 1);
        auVar134._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar245;
        bVar67 = (bool)(bVar59 >> 5 & 1);
        auVar134._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar246;
        bVar67 = (bool)(bVar59 >> 6 & 1);
        auVar134._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar247;
        auVar134._28_4_ =
             (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar117._28_4_;
        local_340 = vminps_avx(auVar120,auVar134);
        auVar285 = ZEXT3264(local_340);
        uVar20 = vcmpps_avx512vl(_local_800,local_340,2);
        bVar55 = bVar55 & 0x7f & (byte)uVar20;
        if (bVar55 != 0) {
          auVar98 = vmaxps_avx512vl(auVar115,auVar101);
          auVar101 = vfmadd213ps_avx512vl(auVar108,auVar123,auVar109);
          fVar265 = auVar104._0_4_;
          fVar281 = auVar104._4_4_;
          auVar39._4_4_ = fVar281 * auVar101._4_4_;
          auVar39._0_4_ = fVar265 * auVar101._0_4_;
          fVar282 = auVar104._8_4_;
          auVar39._8_4_ = fVar282 * auVar101._8_4_;
          fVar283 = auVar104._12_4_;
          auVar39._12_4_ = fVar283 * auVar101._12_4_;
          fVar245 = auVar104._16_4_;
          auVar39._16_4_ = fVar245 * auVar101._16_4_;
          fVar246 = auVar104._20_4_;
          auVar39._20_4_ = fVar246 * auVar101._20_4_;
          fVar247 = auVar104._24_4_;
          auVar39._24_4_ = fVar247 * auVar101._24_4_;
          auVar39._28_4_ = auVar101._28_4_;
          auVar101 = vfmadd213ps_avx512vl(local_5e0,auVar123,auVar109);
          auVar40._4_4_ = fVar281 * auVar101._4_4_;
          auVar40._0_4_ = fVar265 * auVar101._0_4_;
          auVar40._8_4_ = fVar282 * auVar101._8_4_;
          auVar40._12_4_ = fVar283 * auVar101._12_4_;
          auVar40._16_4_ = fVar245 * auVar101._16_4_;
          auVar40._20_4_ = fVar246 * auVar101._20_4_;
          auVar40._24_4_ = fVar247 * auVar101._24_4_;
          auVar40._28_4_ = auVar133._28_4_;
          auVar101 = vminps_avx512vl(auVar39,auVar130);
          auVar49 = ZEXT812(0);
          auVar116 = ZEXT1232(auVar49) << 0x20;
          auVar101 = vmaxps_avx(auVar101,ZEXT1232(auVar49) << 0x20);
          auVar117 = vminps_avx512vl(auVar40,auVar130);
          auVar41._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
          auVar41._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
          auVar41._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
          auVar41._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
          auVar41._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
          auVar41._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
          auVar41._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
          auVar41._28_4_ = auVar101._28_4_ + 7.0;
          auVar77 = vfmadd213ps_fma(auVar41,auVar162,auVar254);
          local_1e0 = ZEXT1632(auVar77);
          auVar101 = vmaxps_avx(auVar117,ZEXT1232(auVar49) << 0x20);
          auVar42._4_4_ = (auVar101._4_4_ + 1.0) * 0.125;
          auVar42._0_4_ = (auVar101._0_4_ + 0.0) * 0.125;
          auVar42._8_4_ = (auVar101._8_4_ + 2.0) * 0.125;
          auVar42._12_4_ = (auVar101._12_4_ + 3.0) * 0.125;
          auVar42._16_4_ = (auVar101._16_4_ + 4.0) * 0.125;
          auVar42._20_4_ = (auVar101._20_4_ + 5.0) * 0.125;
          auVar42._24_4_ = (auVar101._24_4_ + 6.0) * 0.125;
          auVar42._28_4_ = auVar101._28_4_ + 7.0;
          auVar77 = vfmadd213ps_fma(auVar42,auVar162,auVar254);
          local_200 = ZEXT1632(auVar77);
          auVar43._4_4_ = auVar98._4_4_ * auVar98._4_4_;
          auVar43._0_4_ = auVar98._0_4_ * auVar98._0_4_;
          auVar43._8_4_ = auVar98._8_4_ * auVar98._8_4_;
          auVar43._12_4_ = auVar98._12_4_ * auVar98._12_4_;
          auVar43._16_4_ = auVar98._16_4_ * auVar98._16_4_;
          auVar43._20_4_ = auVar98._20_4_ * auVar98._20_4_;
          auVar43._24_4_ = auVar98._24_4_ * auVar98._24_4_;
          auVar43._28_4_ = auVar98._28_4_;
          auVar101 = vsubps_avx(local_7e0,auVar43);
          local_8a0 = auVar122._0_4_;
          fStack_89c = auVar122._4_4_;
          fStack_898 = auVar122._8_4_;
          fStack_894 = auVar122._12_4_;
          fStack_890 = auVar122._16_4_;
          fStack_88c = auVar122._20_4_;
          fStack_888 = auVar122._24_4_;
          auVar44._4_4_ = auVar101._4_4_ * fStack_89c;
          auVar44._0_4_ = auVar101._0_4_ * local_8a0;
          auVar44._8_4_ = auVar101._8_4_ * fStack_898;
          auVar44._12_4_ = auVar101._12_4_ * fStack_894;
          auVar44._16_4_ = auVar101._16_4_ * fStack_890;
          auVar44._20_4_ = auVar101._20_4_ * fStack_88c;
          auVar44._24_4_ = auVar101._24_4_ * fStack_888;
          auVar44._28_4_ = auVar98._28_4_;
          auVar98 = vsubps_avx(local_720,auVar44);
          uVar20 = vcmpps_avx512vl(auVar98,ZEXT1232(auVar49) << 0x20,5);
          bVar59 = (byte)uVar20;
          if (bVar59 == 0) {
            bVar59 = 0;
            auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar196 = ZEXT864(0) << 0x20;
            auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar117 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar286 = ZEXT864(0) << 0x20;
            auVar135._8_4_ = 0x7f800000;
            auVar135._0_8_ = 0x7f8000007f800000;
            auVar135._12_4_ = 0x7f800000;
            auVar135._16_4_ = 0x7f800000;
            auVar135._20_4_ = 0x7f800000;
            auVar135._24_4_ = 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar136._8_4_ = 0xff800000;
            auVar136._0_8_ = 0xff800000ff800000;
            auVar136._12_4_ = 0xff800000;
            auVar136._16_4_ = 0xff800000;
            auVar136._20_4_ = 0xff800000;
            auVar136._24_4_ = 0xff800000;
            auVar136._28_4_ = 0xff800000;
          }
          else {
            auVar78 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
            uVar68 = vcmpps_avx512vl(auVar98,auVar115,5);
            auVar98 = vsqrtps_avx(auVar98);
            auVar116 = vfnmadd213ps_avx512vl(auVar125,_local_600,auVar130);
            auVar118 = vfmadd132ps_avx512vl(auVar116,_local_600,_local_600);
            auVar116 = vsubps_avx(local_620,auVar98);
            auVar108 = vmulps_avx512vl(auVar116,auVar118);
            auVar98 = vsubps_avx512vl(auVar98,auVar121);
            auVar118 = vmulps_avx512vl(auVar98,auVar118);
            auVar98 = vfmadd213ps_avx512vl(auVar123,auVar108,auVar109);
            auVar45._4_4_ = fVar281 * auVar98._4_4_;
            auVar45._0_4_ = fVar265 * auVar98._0_4_;
            auVar45._8_4_ = fVar282 * auVar98._8_4_;
            auVar45._12_4_ = fVar283 * auVar98._12_4_;
            auVar45._16_4_ = fVar245 * auVar98._16_4_;
            auVar45._20_4_ = fVar246 * auVar98._20_4_;
            auVar45._24_4_ = fVar247 * auVar98._24_4_;
            auVar45._28_4_ = auVar117._28_4_;
            auVar46._4_4_ = (float)local_580._4_4_ * auVar108._4_4_;
            auVar46._0_4_ = (float)local_580._0_4_ * auVar108._0_4_;
            auVar46._8_4_ = fStack_578 * auVar108._8_4_;
            auVar46._12_4_ = fStack_574 * auVar108._12_4_;
            auVar46._16_4_ = fStack_570 * auVar108._16_4_;
            auVar46._20_4_ = fStack_56c * auVar108._20_4_;
            auVar46._24_4_ = fStack_568 * auVar108._24_4_;
            auVar46._28_4_ = auVar98._28_4_;
            auVar116 = vmulps_avx512vl(local_5a0,auVar108);
            auVar110 = vmulps_avx512vl(local_5c0,auVar108);
            auVar98 = vfmadd213ps_avx512vl(auVar99,auVar45,auVar105);
            auVar98 = vsubps_avx512vl(auVar46,auVar98);
            auVar117 = vfmadd213ps_avx512vl(auVar102,auVar45,auVar106);
            auVar117 = vsubps_avx512vl(auVar116,auVar117);
            auVar77 = vfmadd213ps_fma(auVar45,auVar103,auVar107);
            auVar116 = vsubps_avx(auVar110,ZEXT1632(auVar77));
            auVar286 = ZEXT3264(auVar116);
            auVar109 = vfmadd213ps_avx512vl(auVar123,auVar118,auVar109);
            auVar104 = vmulps_avx512vl(auVar104,auVar109);
            auVar47._4_4_ = (float)local_580._4_4_ * auVar118._4_4_;
            auVar47._0_4_ = (float)local_580._0_4_ * auVar118._0_4_;
            auVar47._8_4_ = fStack_578 * auVar118._8_4_;
            auVar47._12_4_ = fStack_574 * auVar118._12_4_;
            auVar47._16_4_ = fStack_570 * auVar118._16_4_;
            auVar47._20_4_ = fStack_56c * auVar118._20_4_;
            auVar47._24_4_ = fStack_568 * auVar118._24_4_;
            auVar47._28_4_ = auVar110._28_4_;
            auVar109 = vmulps_avx512vl(local_5a0,auVar118);
            auVar110 = vmulps_avx512vl(local_5c0,auVar118);
            auVar77 = vfmadd213ps_fma(auVar99,auVar104,auVar105);
            auVar116 = vsubps_avx(auVar47,ZEXT1632(auVar77));
            auVar77 = vfmadd213ps_fma(auVar102,auVar104,auVar106);
            auVar99 = vsubps_avx512vl(auVar109,ZEXT1632(auVar77));
            auVar77 = vfmadd213ps_fma(auVar103,auVar104,auVar107);
            auVar102 = vsubps_avx512vl(auVar110,ZEXT1632(auVar77));
            auVar196 = ZEXT3264(auVar102);
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar102 = vblendmps_avx512vl(auVar163,auVar108);
            bVar67 = (bool)((byte)uVar68 & 1);
            auVar135._0_4_ = (uint)bVar67 * auVar102._0_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar67 * auVar102._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar67 * auVar102._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar67 * auVar102._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar135._16_4_ = (uint)bVar67 * auVar102._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar135._20_4_ = (uint)bVar67 * auVar102._20_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar135._24_4_ = (uint)bVar67 * auVar102._24_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = SUB81(uVar68 >> 7,0);
            auVar135._28_4_ = (uint)bVar67 * auVar102._28_4_ | (uint)!bVar67 * 0x7f800000;
            auVar222._8_4_ = 0xff800000;
            auVar222._0_8_ = 0xff800000ff800000;
            auVar222._12_4_ = 0xff800000;
            auVar222._16_4_ = 0xff800000;
            auVar222._20_4_ = 0xff800000;
            auVar222._24_4_ = 0xff800000;
            auVar222._28_4_ = 0xff800000;
            auVar102 = vblendmps_avx512vl(auVar222,auVar118);
            bVar67 = (bool)((byte)uVar68 & 1);
            auVar136._0_4_ = (uint)bVar67 * auVar102._0_4_ | (uint)!bVar67 * -0x800000;
            bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar136._4_4_ = (uint)bVar67 * auVar102._4_4_ | (uint)!bVar67 * -0x800000;
            bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar136._8_4_ = (uint)bVar67 * auVar102._8_4_ | (uint)!bVar67 * -0x800000;
            bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar136._12_4_ = (uint)bVar67 * auVar102._12_4_ | (uint)!bVar67 * -0x800000;
            bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar136._16_4_ = (uint)bVar67 * auVar102._16_4_ | (uint)!bVar67 * -0x800000;
            bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar136._20_4_ = (uint)bVar67 * auVar102._20_4_ | (uint)!bVar67 * -0x800000;
            bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar136._24_4_ = (uint)bVar67 * auVar102._24_4_ | (uint)!bVar67 * -0x800000;
            bVar67 = SUB81(uVar68 >> 7,0);
            auVar136._28_4_ = (uint)bVar67 * auVar102._28_4_ | (uint)!bVar67 * -0x800000;
            auVar33._8_4_ = 0x36000000;
            auVar33._0_8_ = 0x3600000036000000;
            auVar33._12_4_ = 0x36000000;
            auVar33._16_4_ = 0x36000000;
            auVar33._20_4_ = 0x36000000;
            auVar33._24_4_ = 0x36000000;
            auVar33._28_4_ = 0x36000000;
            auVar102 = vmulps_avx512vl(local_640,auVar33);
            uVar21 = vcmpps_avx512vl(auVar102,local_660,0xe);
            uVar68 = uVar68 & uVar21;
            bVar60 = (byte)uVar68;
            if (bVar60 != 0) {
              uVar21 = vcmpps_avx512vl(auVar101,ZEXT1632(auVar78),2);
              auVar275._8_4_ = 0x7f800000;
              auVar275._0_8_ = 0x7f8000007f800000;
              auVar275._12_4_ = 0x7f800000;
              auVar275._16_4_ = 0x7f800000;
              auVar275._20_4_ = 0x7f800000;
              auVar275._24_4_ = 0x7f800000;
              auVar275._28_4_ = 0x7f800000;
              auVar292._8_4_ = 0xff800000;
              auVar292._0_8_ = 0xff800000ff800000;
              auVar292._12_4_ = 0xff800000;
              auVar292._16_4_ = 0xff800000;
              auVar292._20_4_ = 0xff800000;
              auVar292._24_4_ = 0xff800000;
              auVar292._28_4_ = 0xff800000;
              auVar101 = vblendmps_avx512vl(auVar275,auVar292);
              bVar64 = (byte)uVar21;
              uVar69 = (uint)(bVar64 & 1) * auVar101._0_4_ |
                       (uint)!(bool)(bVar64 & 1) * auVar102._0_4_;
              bVar67 = (bool)((byte)(uVar21 >> 1) & 1);
              uVar143 = (uint)bVar67 * auVar101._4_4_ | (uint)!bVar67 * auVar102._4_4_;
              bVar67 = (bool)((byte)(uVar21 >> 2) & 1);
              uVar144 = (uint)bVar67 * auVar101._8_4_ | (uint)!bVar67 * auVar102._8_4_;
              bVar67 = (bool)((byte)(uVar21 >> 3) & 1);
              uVar145 = (uint)bVar67 * auVar101._12_4_ | (uint)!bVar67 * auVar102._12_4_;
              bVar67 = (bool)((byte)(uVar21 >> 4) & 1);
              uVar146 = (uint)bVar67 * auVar101._16_4_ | (uint)!bVar67 * auVar102._16_4_;
              bVar67 = (bool)((byte)(uVar21 >> 5) & 1);
              uVar147 = (uint)bVar67 * auVar101._20_4_ | (uint)!bVar67 * auVar102._20_4_;
              bVar67 = (bool)((byte)(uVar21 >> 6) & 1);
              uVar148 = (uint)bVar67 * auVar101._24_4_ | (uint)!bVar67 * auVar102._24_4_;
              bVar67 = SUB81(uVar21 >> 7,0);
              uVar149 = (uint)bVar67 * auVar101._28_4_ | (uint)!bVar67 * auVar102._28_4_;
              auVar135._0_4_ = (bVar60 & 1) * uVar69 | !(bool)(bVar60 & 1) * auVar135._0_4_;
              bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
              auVar135._4_4_ = bVar67 * uVar143 | !bVar67 * auVar135._4_4_;
              bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
              auVar135._8_4_ = bVar67 * uVar144 | !bVar67 * auVar135._8_4_;
              bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
              auVar135._12_4_ = bVar67 * uVar145 | !bVar67 * auVar135._12_4_;
              bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
              auVar135._16_4_ = bVar67 * uVar146 | !bVar67 * auVar135._16_4_;
              bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
              auVar135._20_4_ = bVar67 * uVar147 | !bVar67 * auVar135._20_4_;
              bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
              auVar135._24_4_ = bVar67 * uVar148 | !bVar67 * auVar135._24_4_;
              bVar67 = SUB81(uVar68 >> 7,0);
              auVar135._28_4_ = bVar67 * uVar149 | !bVar67 * auVar135._28_4_;
              auVar101 = vblendmps_avx512vl(auVar292,auVar275);
              bVar67 = (bool)((byte)(uVar21 >> 1) & 1);
              bVar9 = (bool)((byte)(uVar21 >> 2) & 1);
              bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
              bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
              bVar12 = (bool)((byte)(uVar21 >> 5) & 1);
              bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
              bVar14 = SUB81(uVar21 >> 7,0);
              auVar136._0_4_ =
                   (uint)(bVar60 & 1) *
                   ((uint)(bVar64 & 1) * auVar101._0_4_ | !(bool)(bVar64 & 1) * uVar69) |
                   !(bool)(bVar60 & 1) * auVar136._0_4_;
              bVar8 = (bool)((byte)(uVar68 >> 1) & 1);
              auVar136._4_4_ =
                   (uint)bVar8 * ((uint)bVar67 * auVar101._4_4_ | !bVar67 * uVar143) |
                   !bVar8 * auVar136._4_4_;
              bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
              auVar136._8_4_ =
                   (uint)bVar67 * ((uint)bVar9 * auVar101._8_4_ | !bVar9 * uVar144) |
                   !bVar67 * auVar136._8_4_;
              bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
              auVar136._12_4_ =
                   (uint)bVar67 * ((uint)bVar10 * auVar101._12_4_ | !bVar10 * uVar145) |
                   !bVar67 * auVar136._12_4_;
              bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
              auVar136._16_4_ =
                   (uint)bVar67 * ((uint)bVar11 * auVar101._16_4_ | !bVar11 * uVar146) |
                   !bVar67 * auVar136._16_4_;
              bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
              auVar136._20_4_ =
                   (uint)bVar67 * ((uint)bVar12 * auVar101._20_4_ | !bVar12 * uVar147) |
                   !bVar67 * auVar136._20_4_;
              bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
              auVar136._24_4_ =
                   (uint)bVar67 * ((uint)bVar13 * auVar101._24_4_ | !bVar13 * uVar148) |
                   !bVar67 * auVar136._24_4_;
              bVar67 = SUB81(uVar68 >> 7,0);
              auVar136._28_4_ =
                   (uint)bVar67 * ((uint)bVar14 * auVar101._28_4_ | !bVar14 * uVar149) |
                   !bVar67 * auVar136._28_4_;
              bVar59 = (~bVar60 | bVar64) & bVar59;
            }
          }
          auVar293 = ZEXT3264(local_5c0);
          auVar276._0_4_ = local_5c0._0_4_ * auVar196._0_4_;
          auVar276._4_4_ = local_5c0._4_4_ * auVar196._4_4_;
          auVar276._8_4_ = local_5c0._8_4_ * auVar196._8_4_;
          auVar276._12_4_ = local_5c0._12_4_ * auVar196._12_4_;
          auVar276._16_4_ = local_5c0._16_4_ * auVar196._16_4_;
          auVar276._20_4_ = local_5c0._20_4_ * auVar196._20_4_;
          auVar276._28_36_ = auVar196._28_36_;
          auVar276._24_4_ = local_5c0._24_4_ * auVar196._24_4_;
          auVar280 = ZEXT3264(local_5a0);
          auVar77 = vfmadd231ps_fma(auVar276._0_32_,local_5a0,auVar99);
          auVar276 = ZEXT3264(_local_580);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),_local_580,auVar116);
          auVar270._8_4_ = 0x7fffffff;
          auVar270._0_8_ = 0x7fffffff7fffffff;
          auVar270._12_4_ = 0x7fffffff;
          auVar270._16_4_ = 0x7fffffff;
          auVar270._20_4_ = 0x7fffffff;
          auVar270._24_4_ = 0x7fffffff;
          auVar270._28_4_ = 0x7fffffff;
          auVar101 = vandps_avx(ZEXT1632(auVar77),auVar270);
          auVar288 = ZEXT3264(_local_800);
          _local_1c0 = _local_800;
          auVar264._8_4_ = 0x3e99999a;
          auVar264._0_8_ = 0x3e99999a3e99999a;
          auVar264._12_4_ = 0x3e99999a;
          auVar264._16_4_ = 0x3e99999a;
          auVar264._20_4_ = 0x3e99999a;
          auVar264._24_4_ = 0x3e99999a;
          auVar264._28_4_ = 0x3e99999a;
          uVar20 = vcmpps_avx512vl(auVar101,auVar264,1);
          local_560._0_2_ = (short)uVar20;
          local_360 = vmaxps_avx(_local_800,auVar136);
          auVar101 = vminps_avx(local_340,auVar135);
          uVar20 = vcmpps_avx512vl(_local_800,auVar101,2);
          bVar60 = (byte)uVar20 & bVar55;
          uVar22 = vcmpps_avx512vl(local_360,local_340,2);
          if ((bVar55 & ((byte)uVar22 | (byte)uVar20)) != 0) {
            auVar48._4_4_ = local_5c0._4_4_ * auVar286._4_4_;
            auVar48._0_4_ = local_5c0._0_4_ * auVar286._0_4_;
            auVar48._8_4_ = local_5c0._8_4_ * auVar286._8_4_;
            auVar48._12_4_ = local_5c0._12_4_ * auVar286._12_4_;
            auVar48._16_4_ = local_5c0._16_4_ * auVar286._16_4_;
            auVar48._20_4_ = local_5c0._20_4_ * auVar286._20_4_;
            auVar48._24_4_ = local_5c0._24_4_ * auVar286._24_4_;
            auVar48._28_4_ = auVar101._28_4_;
            auVar77 = vfmadd213ps_fma(auVar117,local_5a0,auVar48);
            auVar77 = vfmadd213ps_fma(auVar98,_local_580,ZEXT1632(auVar77));
            auVar101 = vandps_avx(ZEXT1632(auVar77),auVar270);
            uVar20 = vcmpps_avx512vl(auVar101,auVar264,1);
            bVar64 = (byte)uVar20 | ~bVar59;
            auVar164._8_4_ = 2;
            auVar164._0_8_ = 0x200000002;
            auVar164._12_4_ = 2;
            auVar164._16_4_ = 2;
            auVar164._20_4_ = 2;
            auVar164._24_4_ = 2;
            auVar164._28_4_ = 2;
            auVar34._8_4_ = 3;
            auVar34._0_8_ = 0x300000003;
            auVar34._12_4_ = 3;
            auVar34._16_4_ = 3;
            auVar34._20_4_ = 3;
            auVar34._24_4_ = 3;
            auVar34._28_4_ = 3;
            auVar101 = vpblendmd_avx512vl(auVar164,auVar34);
            local_300._0_4_ = (uint)(bVar64 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
            bVar67 = (bool)(bVar64 >> 1 & 1);
            local_300._4_4_ = (uint)bVar67 * auVar101._4_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar64 >> 2 & 1);
            local_300._8_4_ = (uint)bVar67 * auVar101._8_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar64 >> 3 & 1);
            local_300._12_4_ = (uint)bVar67 * auVar101._12_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar64 >> 4 & 1);
            local_300._16_4_ = (uint)bVar67 * auVar101._16_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar64 >> 5 & 1);
            local_300._20_4_ = (uint)bVar67 * auVar101._20_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar64 >> 6 & 1);
            local_300._24_4_ = (uint)bVar67 * auVar101._24_4_ | (uint)!bVar67 * 2;
            local_300._28_4_ =
                 (uint)(bVar64 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
            local_4e0 = vpbroadcastd_avx512vl();
            uVar20 = vpcmpd_avx512vl(local_4e0,local_300,5);
            bVar64 = (byte)uVar20 & bVar60;
            if (bVar64 == 0) {
              auVar166._4_4_ = uVar70;
              auVar166._0_4_ = uVar70;
              auVar166._8_4_ = uVar70;
              auVar166._12_4_ = uVar70;
              auVar166._16_4_ = uVar70;
              auVar166._20_4_ = uVar70;
              auVar166._24_4_ = uVar70;
              auVar166._28_4_ = uVar70;
              auVar101 = local_360;
            }
            else {
              local_320 = local_360;
              auVar78 = vminps_avx(local_740._0_16_,local_780._0_16_);
              auVar77 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
              auVar18 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar19 = vminps_avx(auVar78,auVar18);
              auVar78 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar18 = vmaxps_avx(auVar77,auVar78);
              auVar202._8_4_ = 0x7fffffff;
              auVar202._0_8_ = 0x7fffffff7fffffff;
              auVar202._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx(auVar19,auVar202);
              auVar78 = vandps_avx(auVar18,auVar202);
              auVar77 = vmaxps_avx(auVar77,auVar78);
              auVar78 = vmovshdup_avx(auVar77);
              auVar78 = vmaxss_avx(auVar78,auVar77);
              auVar77 = vshufpd_avx(auVar77,auVar77,1);
              auVar77 = vmaxss_avx(auVar77,auVar78);
              fVar265 = auVar77._0_4_ * 1.9073486e-06;
              local_6c0 = vshufps_avx(auVar18,auVar18,0xff);
              local_540 = (float)local_800._0_4_ + fVar171;
              fStack_53c = (float)local_800._4_4_ + fVar171;
              fStack_538 = fStack_7f8 + fVar171;
              fStack_534 = fStack_7f4 + fVar171;
              fStack_530 = fStack_7f0 + fVar171;
              fStack_52c = fStack_7ec + fVar171;
              fStack_528 = fStack_7e8 + fVar171;
              fStack_524 = fStack_7e4 + fVar171;
              do {
                auVar165._8_4_ = 0x7f800000;
                auVar165._0_8_ = 0x7f8000007f800000;
                auVar165._12_4_ = 0x7f800000;
                auVar165._16_4_ = 0x7f800000;
                auVar165._20_4_ = 0x7f800000;
                auVar165._24_4_ = 0x7f800000;
                auVar165._28_4_ = 0x7f800000;
                auVar101 = vblendmps_avx512vl(auVar165,_local_800);
                auVar137._0_4_ =
                     (uint)(bVar64 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
                bVar67 = (bool)(bVar64 >> 1 & 1);
                auVar137._4_4_ = (uint)bVar67 * auVar101._4_4_ | (uint)!bVar67 * 0x7f800000;
                bVar67 = (bool)(bVar64 >> 2 & 1);
                auVar137._8_4_ = (uint)bVar67 * auVar101._8_4_ | (uint)!bVar67 * 0x7f800000;
                bVar67 = (bool)(bVar64 >> 3 & 1);
                auVar137._12_4_ = (uint)bVar67 * auVar101._12_4_ | (uint)!bVar67 * 0x7f800000;
                bVar67 = (bool)(bVar64 >> 4 & 1);
                auVar137._16_4_ = (uint)bVar67 * auVar101._16_4_ | (uint)!bVar67 * 0x7f800000;
                bVar67 = (bool)(bVar64 >> 5 & 1);
                auVar137._20_4_ = (uint)bVar67 * auVar101._20_4_ | (uint)!bVar67 * 0x7f800000;
                auVar137._24_4_ =
                     (uint)(bVar64 >> 6) * auVar101._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000
                ;
                auVar137._28_4_ = 0x7f800000;
                auVar101 = vshufps_avx(auVar137,auVar137,0xb1);
                auVar101 = vminps_avx(auVar137,auVar101);
                auVar98 = vshufpd_avx(auVar101,auVar101,5);
                auVar101 = vminps_avx(auVar101,auVar98);
                auVar98 = vpermpd_avx2(auVar101,0x4e);
                auVar101 = vminps_avx(auVar101,auVar98);
                uVar20 = vcmpps_avx512vl(auVar137,auVar101,0);
                bVar56 = (byte)uVar20 & bVar64;
                bVar57 = bVar64;
                if (bVar56 != 0) {
                  bVar57 = bVar56;
                }
                iVar24 = 0;
                for (uVar70 = (uint)bVar57; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                  iVar24 = iVar24 + 1;
                }
                uVar70 = *(uint *)(local_1e0 + (uint)(iVar24 << 2));
                uVar69 = *(uint *)(local_1c0 + (uint)(iVar24 << 2));
                fVar281 = auVar74._0_4_;
                if ((float)local_7c0._0_4_ < 0.0) {
                  fVar281 = sqrtf((float)local_7c0._0_4_);
                }
                auVar77 = vinsertps_avx(ZEXT416(uVar69),ZEXT416(uVar70),0x10);
                auVar285 = ZEXT1664(auVar77);
                bVar67 = true;
                uVar68 = 0;
                do {
                  uVar177 = auVar285._0_4_;
                  auVar155._4_4_ = uVar177;
                  auVar155._0_4_ = uVar177;
                  auVar155._8_4_ = uVar177;
                  auVar155._12_4_ = uVar177;
                  auVar77 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_7b0);
                  local_720 = auVar285._0_32_;
                  auVar78 = vmovshdup_avx(auVar285._0_16_);
                  fVar257 = auVar78._0_4_;
                  fVar297 = 1.0 - fVar257;
                  fVar283 = fVar297 * fVar297 * fVar297;
                  fVar247 = fVar257 * fVar257 * fVar257;
                  auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar283),
                                            ZEXT416((uint)fVar247));
                  fVar282 = fVar257 * fVar297;
                  auVar251 = ZEXT416((uint)fVar297);
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar257 * 6.0)),
                                            ZEXT416((uint)(fVar282 * fVar297)),
                                            SUB6416(ZEXT464(0x41400000),0));
                  auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar247),
                                            ZEXT416((uint)fVar283));
                  auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar297 * 6.0)),
                                            SUB6416(ZEXT464(0x41400000),0),
                                            ZEXT416((uint)(fVar282 * fVar257)));
                  fVar283 = fVar283 * 0.16666667;
                  fVar245 = (auVar18._0_4_ + auVar79._0_4_) * 0.16666667;
                  fVar246 = (auVar19._0_4_ + auVar76._0_4_) * 0.16666667;
                  fVar247 = fVar247 * 0.16666667;
                  auVar203._0_4_ = fVar247 * (float)local_7a0._0_4_;
                  auVar203._4_4_ = fVar247 * (float)local_7a0._4_4_;
                  auVar203._8_4_ = fVar247 * fStack_798;
                  auVar203._12_4_ = fVar247 * fStack_794;
                  auVar252._4_4_ = fVar246;
                  auVar252._0_4_ = fVar246;
                  auVar252._8_4_ = fVar246;
                  auVar252._12_4_ = fVar246;
                  auVar18 = vfmadd132ps_fma(auVar252,auVar203,local_760._0_16_);
                  auVar204._4_4_ = fVar245;
                  auVar204._0_4_ = fVar245;
                  auVar204._8_4_ = fVar245;
                  auVar204._12_4_ = fVar245;
                  auVar18 = vfmadd132ps_fma(auVar204,auVar18,local_780._0_16_);
                  auVar181._4_4_ = fVar283;
                  auVar181._0_4_ = fVar283;
                  auVar181._8_4_ = fVar283;
                  auVar181._12_4_ = fVar283;
                  auVar18 = vfmadd132ps_fma(auVar181,auVar18,local_740._0_16_);
                  local_5e0._0_16_ = auVar18;
                  auVar18 = vsubps_avx(auVar77,auVar18);
                  auVar77 = vdpps_avx(auVar18,auVar18,0x7f);
                  local_7e0._0_16_ = auVar77;
                  if (auVar77._0_4_ < 0.0) {
                    auVar280._0_4_ = sqrtf(auVar77._0_4_);
                    auVar280._4_60_ = extraout_var;
                    auVar77 = auVar280._0_16_;
                  }
                  else {
                    auVar77 = vsqrtss_avx(auVar77,auVar77);
                  }
                  local_600._4_4_ = fVar297;
                  local_600._0_4_ = fVar297;
                  fStack_5f8 = fVar297;
                  fStack_5f4 = fVar297;
                  auVar79 = vfnmsub213ss_fma(auVar78,auVar78,ZEXT416((uint)(fVar282 * 4.0)));
                  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * 4.0)),auVar251,auVar251);
                  fVar282 = fVar297 * -fVar297 * 0.5;
                  fVar283 = auVar79._0_4_ * 0.5;
                  fVar245 = auVar19._0_4_ * 0.5;
                  fVar246 = fVar257 * fVar257 * 0.5;
                  auVar232._0_4_ = fVar246 * (float)local_7a0._0_4_;
                  auVar232._4_4_ = fVar246 * (float)local_7a0._4_4_;
                  auVar232._8_4_ = fVar246 * fStack_798;
                  auVar232._12_4_ = fVar246 * fStack_794;
                  auVar182._4_4_ = fVar245;
                  auVar182._0_4_ = fVar245;
                  auVar182._8_4_ = fVar245;
                  auVar182._12_4_ = fVar245;
                  auVar19 = vfmadd132ps_fma(auVar182,auVar232,local_760._0_16_);
                  auVar205._4_4_ = fVar283;
                  auVar205._0_4_ = fVar283;
                  auVar205._8_4_ = fVar283;
                  auVar205._12_4_ = fVar283;
                  auVar19 = vfmadd132ps_fma(auVar205,auVar19,local_780._0_16_);
                  auVar290._4_4_ = fVar282;
                  auVar290._0_4_ = fVar282;
                  auVar290._8_4_ = fVar282;
                  auVar290._12_4_ = fVar282;
                  auVar19 = vfmadd132ps_fma(auVar290,auVar19,local_740._0_16_);
                  local_620._0_16_ = vdpps_avx(auVar19,auVar19,0x7f);
                  auVar50._12_4_ = 0;
                  auVar50._0_12_ = ZEXT812(0);
                  fVar282 = local_620._0_4_;
                  auVar79 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar282));
                  fVar283 = auVar79._0_4_;
                  local_640._0_16_ = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar282));
                  auVar79 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
                  local_660._0_4_ = auVar79._0_4_;
                  uVar70 = auVar77._0_4_;
                  if (fVar282 < -fVar282) {
                    fVar245 = sqrtf(fVar282);
                    auVar77 = ZEXT416(uVar70);
                  }
                  else {
                    auVar79 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                    fVar245 = auVar79._0_4_;
                  }
                  fVar282 = fVar283 * 1.5 + fVar282 * -0.5 * fVar283 * fVar283 * fVar283;
                  auVar156._0_4_ = auVar19._0_4_ * fVar282;
                  auVar156._4_4_ = auVar19._4_4_ * fVar282;
                  auVar156._8_4_ = auVar19._8_4_ * fVar282;
                  auVar156._12_4_ = auVar19._12_4_ * fVar282;
                  auVar79 = vdpps_avx(auVar18,auVar156,0x7f);
                  fVar247 = auVar77._0_4_;
                  fVar283 = auVar79._0_4_;
                  auVar157._0_4_ = fVar283 * fVar283;
                  auVar157._4_4_ = auVar79._4_4_ * auVar79._4_4_;
                  auVar157._8_4_ = auVar79._8_4_ * auVar79._8_4_;
                  auVar157._12_4_ = auVar79._12_4_ * auVar79._12_4_;
                  auVar76 = vsubps_avx(local_7e0._0_16_,auVar157);
                  fVar246 = auVar76._0_4_;
                  auVar183._4_12_ = ZEXT812(0) << 0x20;
                  auVar183._0_4_ = fVar246;
                  auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
                  auVar81 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
                  auVar82 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
                  if (fVar246 < 0.0) {
                    local_680._0_4_ = fVar245;
                    local_6a0._0_4_ = auVar81._0_4_;
                    local_6b0._4_4_ = fVar282;
                    local_6b0._0_4_ = fVar282;
                    fStack_6a8 = fVar282;
                    fStack_6a4 = fVar282;
                    local_690 = auVar80;
                    fVar246 = sqrtf(fVar246);
                    auVar82 = ZEXT416(auVar82._0_4_);
                    auVar81 = ZEXT416((uint)local_6a0._0_4_);
                    auVar77 = ZEXT416(uVar70);
                    auVar80 = local_690;
                    fVar282 = (float)local_6b0._0_4_;
                    fVar297 = (float)local_6b0._4_4_;
                    fVar257 = fStack_6a8;
                    fVar298 = fStack_6a4;
                    fVar245 = (float)local_680._0_4_;
                  }
                  else {
                    auVar76 = vsqrtss_avx(auVar76,auVar76);
                    fVar246 = auVar76._0_4_;
                    fVar297 = fVar282;
                    fVar257 = fVar282;
                    fVar298 = fVar282;
                  }
                  auVar293 = ZEXT1664(auVar19);
                  auVar288 = ZEXT1664(local_7e0._0_16_);
                  auVar286 = ZEXT1664(auVar18);
                  auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar251,auVar78);
                  auVar251 = vfmadd213ss_fma(auVar78,SUB6416(ZEXT464(0xc0000000),0),auVar251);
                  auVar85 = local_720._0_16_;
                  auVar78 = vshufps_avx(auVar85,auVar85,0x55);
                  auVar206._0_4_ = auVar78._0_4_ * (float)local_7a0._0_4_;
                  auVar206._4_4_ = auVar78._4_4_ * (float)local_7a0._4_4_;
                  auVar206._8_4_ = auVar78._8_4_ * fStack_798;
                  auVar206._12_4_ = auVar78._12_4_ * fStack_794;
                  auVar233._0_4_ = auVar251._0_4_;
                  auVar233._4_4_ = auVar233._0_4_;
                  auVar233._8_4_ = auVar233._0_4_;
                  auVar233._12_4_ = auVar233._0_4_;
                  auVar78 = vfmadd132ps_fma(auVar233,auVar206,local_760._0_16_);
                  auVar184._0_4_ = auVar76._0_4_;
                  auVar184._4_4_ = auVar184._0_4_;
                  auVar184._8_4_ = auVar184._0_4_;
                  auVar184._12_4_ = auVar184._0_4_;
                  auVar78 = vfmadd132ps_fma(auVar184,auVar78,local_780._0_16_);
                  auVar78 = vfmadd132ps_fma(_local_600,auVar78,local_740._0_16_);
                  auVar185._0_4_ = auVar78._0_4_ * (float)local_620._0_4_;
                  auVar185._4_4_ = auVar78._4_4_ * (float)local_620._0_4_;
                  auVar185._8_4_ = auVar78._8_4_ * (float)local_620._0_4_;
                  auVar185._12_4_ = auVar78._12_4_ * (float)local_620._0_4_;
                  auVar78 = vdpps_avx(auVar19,auVar78,0x7f);
                  fVar198 = auVar78._0_4_;
                  auVar207._0_4_ = auVar19._0_4_ * fVar198;
                  auVar207._4_4_ = auVar19._4_4_ * fVar198;
                  auVar207._8_4_ = auVar19._8_4_ * fVar198;
                  auVar207._12_4_ = auVar19._12_4_ * fVar198;
                  auVar78 = vsubps_avx(auVar185,auVar207);
                  fVar198 = (float)local_660._0_4_ * (float)local_640._0_4_;
                  auVar251 = vmaxss_avx(ZEXT416((uint)fVar265),
                                        ZEXT416((uint)(local_720._0_4_ * fVar281 * 1.9073486e-06)));
                  auVar26._8_4_ = 0x80000000;
                  auVar26._0_8_ = 0x8000000080000000;
                  auVar26._12_4_ = 0x80000000;
                  auVar83 = vxorps_avx512vl(auVar19,auVar26);
                  auVar208._0_4_ = fVar282 * auVar78._0_4_ * fVar198;
                  auVar208._4_4_ = fVar297 * auVar78._4_4_ * fVar198;
                  auVar208._8_4_ = fVar257 * auVar78._8_4_ * fVar198;
                  auVar208._12_4_ = fVar298 * auVar78._12_4_ * fVar198;
                  auVar78 = vdpps_avx(auVar83,auVar156,0x7f);
                  auVar76 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar265),auVar251);
                  auVar77 = vdpps_avx(auVar18,auVar208,0x7f);
                  auVar84 = vfmadd213ss_fma(ZEXT416((uint)(fVar247 + 1.0)),
                                            ZEXT416((uint)(fVar265 / fVar245)),auVar76);
                  fVar282 = auVar78._0_4_ + auVar77._0_4_;
                  auVar77 = vdpps_avx(local_7b0,auVar156,0x7f);
                  auVar78 = vdpps_avx(auVar18,auVar83,0x7f);
                  auVar76 = vmulss_avx512f(auVar82,auVar80);
                  auVar82 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar76._0_4_ *
                                                                 auVar80._0_4_ * auVar80._0_4_)));
                  auVar76 = vdpps_avx(auVar18,local_7b0,0x7f);
                  auVar81 = vfnmadd231ss_fma(auVar78,auVar79,ZEXT416((uint)fVar282));
                  auVar76 = vfnmadd231ss_fma(auVar76,auVar79,auVar77);
                  auVar78 = vpermilps_avx(local_5e0._0_16_,0xff);
                  fVar246 = fVar246 - auVar78._0_4_;
                  auVar80 = vshufps_avx(auVar19,auVar19,0xff);
                  auVar78 = vfmsub213ss_fma(auVar81,auVar82,auVar80);
                  auVar278._8_4_ = 0x80000000;
                  auVar278._0_8_ = 0x8000000080000000;
                  auVar278._12_4_ = 0x80000000;
                  auVar280 = ZEXT1664(auVar278);
                  auVar273._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
                  auVar273._8_4_ = auVar78._8_4_ ^ 0x80000000;
                  auVar273._12_4_ = auVar78._12_4_ ^ 0x80000000;
                  auVar276 = ZEXT1664(auVar273);
                  auVar76 = ZEXT416((uint)(auVar76._0_4_ * auVar82._0_4_));
                  auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar78._0_4_)),
                                            ZEXT416((uint)fVar282),auVar76);
                  auVar78 = vinsertps_avx(auVar273,auVar76,0x1c);
                  auVar262._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                  auVar262._8_4_ = auVar77._8_4_ ^ 0x80000000;
                  auVar262._12_4_ = auVar77._12_4_ ^ 0x80000000;
                  auVar76 = vinsertps_avx(ZEXT416((uint)fVar282),auVar262,0x10);
                  auVar234._0_4_ = auVar81._0_4_;
                  auVar234._4_4_ = auVar234._0_4_;
                  auVar234._8_4_ = auVar234._0_4_;
                  auVar234._12_4_ = auVar234._0_4_;
                  auVar77 = vdivps_avx(auVar78,auVar234);
                  auVar78 = vdivps_avx(auVar76,auVar234);
                  auVar235._0_4_ = fVar283 * auVar77._0_4_ + fVar246 * auVar78._0_4_;
                  auVar235._4_4_ = fVar283 * auVar77._4_4_ + fVar246 * auVar78._4_4_;
                  auVar235._8_4_ = fVar283 * auVar77._8_4_ + fVar246 * auVar78._8_4_;
                  auVar235._12_4_ = fVar283 * auVar77._12_4_ + fVar246 * auVar78._12_4_;
                  auVar77 = vsubps_avx(auVar85,auVar235);
                  auVar285 = ZEXT1664(auVar77);
                  auVar27._8_4_ = 0x7fffffff;
                  auVar27._0_8_ = 0x7fffffff7fffffff;
                  auVar27._12_4_ = 0x7fffffff;
                  auVar78 = vandps_avx512vl(auVar79,auVar27);
                  if (auVar78._0_4_ < auVar84._0_4_) {
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ + auVar251._0_4_)),
                                              local_6c0,ZEXT416(0x36000000));
                    auVar28._8_4_ = 0x7fffffff;
                    auVar28._0_8_ = 0x7fffffff7fffffff;
                    auVar28._12_4_ = 0x7fffffff;
                    auVar79 = vandps_avx512vl(ZEXT416((uint)fVar246),auVar28);
                    if (auVar79._0_4_ < auVar78._0_4_) {
                      fVar281 = auVar77._0_4_ + (float)local_6d0._0_4_;
                      if (fVar281 < fVar169) {
LAB_01ba8a3b:
                        bVar57 = 0;
                        goto LAB_01ba8a60;
                      }
                      fVar282 = *(float *)(ray + k * 4 + 0x100);
                      if (fVar281 <= fVar282) {
                        auVar78 = vmovshdup_avx(auVar77);
                        bVar57 = 0;
                        if ((auVar78._0_4_ < 0.0) || (1.0 < auVar78._0_4_)) goto LAB_01ba8a60;
                        auVar236._0_12_ = ZEXT812(0);
                        auVar236._12_4_ = 0;
                        auVar209._4_8_ = auVar236._4_8_;
                        auVar209._0_4_ = local_7e0._0_4_;
                        auVar209._12_4_ = 0;
                        auVar78 = vrsqrt14ss_avx512f(auVar236,auVar209);
                        fVar283 = auVar78._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar61].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01ba8a3b;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar57 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01ba8a60;
                        fVar283 = fVar283 * 1.5 +
                                  local_7e0._0_4_ * -0.5 * fVar283 * fVar283 * fVar283;
                        auVar210._0_4_ = auVar18._0_4_ * fVar283;
                        auVar210._4_4_ = auVar18._4_4_ * fVar283;
                        auVar210._8_4_ = auVar18._8_4_ * fVar283;
                        auVar210._12_4_ = auVar18._12_4_ * fVar283;
                        auVar251 = vfmadd213ps_fma(auVar80,auVar210,auVar19);
                        auVar78 = vshufps_avx(auVar210,auVar210,0xc9);
                        auVar79 = vshufps_avx(auVar19,auVar19,0xc9);
                        auVar211._0_4_ = auVar210._0_4_ * auVar79._0_4_;
                        auVar211._4_4_ = auVar210._4_4_ * auVar79._4_4_;
                        auVar211._8_4_ = auVar210._8_4_ * auVar79._8_4_;
                        auVar211._12_4_ = auVar210._12_4_ * auVar79._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar211,auVar19,auVar78);
                        auVar78 = vshufps_avx(auVar76,auVar76,0xc9);
                        auVar79 = vshufps_avx(auVar251,auVar251,0xc9);
                        auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                        auVar158._0_4_ = auVar251._0_4_ * auVar76._0_4_;
                        auVar158._4_4_ = auVar251._4_4_ * auVar76._4_4_;
                        auVar158._8_4_ = auVar251._8_4_ * auVar76._8_4_;
                        auVar158._12_4_ = auVar251._12_4_ * auVar76._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar158,auVar78,auVar79);
                        auVar243._8_4_ = 1;
                        auVar243._0_8_ = 0x100000001;
                        auVar243._12_4_ = 1;
                        auVar243._16_4_ = 1;
                        auVar243._20_4_ = 1;
                        auVar243._24_4_ = 1;
                        auVar243._28_4_ = 1;
                        local_420 = vpermps_avx2(auVar243,ZEXT1632(auVar77));
                        auVar101 = vpermps_avx2(auVar243,ZEXT1632(auVar78));
                        auVar255._8_4_ = 2;
                        auVar255._0_8_ = 0x200000002;
                        auVar255._12_4_ = 2;
                        auVar255._16_4_ = 2;
                        auVar255._20_4_ = 2;
                        auVar255._24_4_ = 2;
                        auVar255._28_4_ = 2;
                        local_460 = vpermps_avx2(auVar255,ZEXT1632(auVar78));
                        local_440 = auVar78._0_4_;
                        local_480[0] = (RTCHitN)auVar101[0];
                        local_480[1] = (RTCHitN)auVar101[1];
                        local_480[2] = (RTCHitN)auVar101[2];
                        local_480[3] = (RTCHitN)auVar101[3];
                        local_480[4] = (RTCHitN)auVar101[4];
                        local_480[5] = (RTCHitN)auVar101[5];
                        local_480[6] = (RTCHitN)auVar101[6];
                        local_480[7] = (RTCHitN)auVar101[7];
                        local_480[8] = (RTCHitN)auVar101[8];
                        local_480[9] = (RTCHitN)auVar101[9];
                        local_480[10] = (RTCHitN)auVar101[10];
                        local_480[0xb] = (RTCHitN)auVar101[0xb];
                        local_480[0xc] = (RTCHitN)auVar101[0xc];
                        local_480[0xd] = (RTCHitN)auVar101[0xd];
                        local_480[0xe] = (RTCHitN)auVar101[0xe];
                        local_480[0xf] = (RTCHitN)auVar101[0xf];
                        local_480[0x10] = (RTCHitN)auVar101[0x10];
                        local_480[0x11] = (RTCHitN)auVar101[0x11];
                        local_480[0x12] = (RTCHitN)auVar101[0x12];
                        local_480[0x13] = (RTCHitN)auVar101[0x13];
                        local_480[0x14] = (RTCHitN)auVar101[0x14];
                        local_480[0x15] = (RTCHitN)auVar101[0x15];
                        local_480[0x16] = (RTCHitN)auVar101[0x16];
                        local_480[0x17] = (RTCHitN)auVar101[0x17];
                        local_480[0x18] = (RTCHitN)auVar101[0x18];
                        local_480[0x19] = (RTCHitN)auVar101[0x19];
                        local_480[0x1a] = (RTCHitN)auVar101[0x1a];
                        local_480[0x1b] = (RTCHitN)auVar101[0x1b];
                        local_480[0x1c] = (RTCHitN)auVar101[0x1c];
                        local_480[0x1d] = (RTCHitN)auVar101[0x1d];
                        local_480[0x1e] = (RTCHitN)auVar101[0x1e];
                        local_480[0x1f] = (RTCHitN)auVar101[0x1f];
                        uStack_43c = local_440;
                        uStack_438 = local_440;
                        uStack_434 = local_440;
                        uStack_430 = local_440;
                        uStack_42c = local_440;
                        uStack_428 = local_440;
                        uStack_424 = local_440;
                        local_400 = ZEXT432(0) << 0x20;
                        local_3e0 = local_4a0._0_8_;
                        uStack_3d8 = local_4a0._8_8_;
                        uStack_3d0 = local_4a0._16_8_;
                        uStack_3c8 = local_4a0._24_8_;
                        local_3c0 = local_4c0;
                        vpcmpeqd_avx2(local_4c0,local_4c0);
                        local_3a0 = context->user->instID[0];
                        uStack_39c = local_3a0;
                        uStack_398 = local_3a0;
                        uStack_394 = local_3a0;
                        uStack_390 = local_3a0;
                        uStack_38c = local_3a0;
                        uStack_388 = local_3a0;
                        uStack_384 = local_3a0;
                        local_380 = context->user->instPrimID[0];
                        uStack_37c = local_380;
                        uStack_378 = local_380;
                        uStack_374 = local_380;
                        uStack_370 = local_380;
                        uStack_36c = local_380;
                        uStack_368 = local_380;
                        uStack_364 = local_380;
                        *(float *)(ray + k * 4 + 0x100) = fVar281;
                        local_700 = local_500;
                        local_830.valid = (int *)local_700;
                        local_830.geometryUserPtr = pGVar3->userPtr;
                        local_830.context = context->user;
                        local_830.hit = local_480;
                        local_830.N = 8;
                        local_830.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar276 = ZEXT1664(auVar273);
                          auVar280 = ZEXT1664(auVar278);
                          auVar285 = ZEXT1664(auVar77);
                          auVar286 = ZEXT1664(auVar18);
                          auVar288 = ZEXT1664(local_7e0._0_16_);
                          auVar293 = ZEXT1664(auVar19);
                          (*pGVar3->occlusionFilterN)(&local_830);
                        }
                        if (local_700 != (undefined1  [32])0x0) {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar276 = ZEXT1664(auVar276._0_16_);
                            auVar280 = ZEXT1664(auVar280._0_16_);
                            auVar285 = ZEXT1664(auVar285._0_16_);
                            auVar286 = ZEXT1664(auVar286._0_16_);
                            auVar288 = ZEXT1664(auVar288._0_16_);
                            auVar293 = ZEXT1664(auVar293._0_16_);
                            (*p_Var7)(&local_830);
                          }
                          uVar68 = vptestmd_avx512vl(local_700,local_700);
                          auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar8 = (bool)((byte)uVar68 & 1);
                          bVar9 = (bool)((byte)(uVar68 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar68 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar68 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar68 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar68 >> 6) & 1);
                          bVar15 = SUB81(uVar68 >> 7,0);
                          *(uint *)(local_830.ray + 0x100) =
                               (uint)bVar8 * auVar101._0_4_ |
                               (uint)!bVar8 * *(int *)(local_830.ray + 0x100);
                          *(uint *)(local_830.ray + 0x104) =
                               (uint)bVar9 * auVar101._4_4_ |
                               (uint)!bVar9 * *(int *)(local_830.ray + 0x104);
                          *(uint *)(local_830.ray + 0x108) =
                               (uint)bVar10 * auVar101._8_4_ |
                               (uint)!bVar10 * *(int *)(local_830.ray + 0x108);
                          *(uint *)(local_830.ray + 0x10c) =
                               (uint)bVar11 * auVar101._12_4_ |
                               (uint)!bVar11 * *(int *)(local_830.ray + 0x10c);
                          *(uint *)(local_830.ray + 0x110) =
                               (uint)bVar12 * auVar101._16_4_ |
                               (uint)!bVar12 * *(int *)(local_830.ray + 0x110);
                          *(uint *)(local_830.ray + 0x114) =
                               (uint)bVar13 * auVar101._20_4_ |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x114);
                          *(uint *)(local_830.ray + 0x118) =
                               (uint)bVar14 * auVar101._24_4_ |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x118);
                          *(uint *)(local_830.ray + 0x11c) =
                               (uint)bVar15 * auVar101._28_4_ |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x11c);
                          bVar57 = 1;
                          if (local_700 != (undefined1  [32])0x0) goto LAB_01ba8a60;
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar282;
                      }
                      bVar57 = 0;
                      goto LAB_01ba8a60;
                    }
                  }
                  bVar67 = uVar68 < 4;
                  uVar68 = uVar68 + 1;
                } while (uVar68 != 5);
                bVar67 = false;
                bVar57 = 5;
LAB_01ba8a60:
                bVar65 = (bool)(bVar65 | bVar67 & bVar57);
                uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar166._4_4_ = uVar177;
                auVar166._0_4_ = uVar177;
                auVar166._8_4_ = uVar177;
                auVar166._12_4_ = uVar177;
                auVar166._16_4_ = uVar177;
                auVar166._20_4_ = uVar177;
                auVar166._24_4_ = uVar177;
                auVar166._28_4_ = uVar177;
                auVar52._4_4_ = fStack_53c;
                auVar52._0_4_ = local_540;
                auVar52._8_4_ = fStack_538;
                auVar52._12_4_ = fStack_534;
                auVar52._16_4_ = fStack_530;
                auVar52._20_4_ = fStack_52c;
                auVar52._24_4_ = fStack_528;
                auVar52._28_4_ = fStack_524;
                uVar20 = vcmpps_avx512vl(auVar166,auVar52,0xd);
                bVar64 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar64 & (byte)uVar20;
                auVar101 = local_320;
              } while (bVar64 != 0);
            }
            auVar196 = ZEXT3264(local_360);
            bVar59 = local_560[0] | ~bVar59;
            auVar192._0_4_ = fVar171 + auVar101._0_4_;
            auVar192._4_4_ = fVar171 + auVar101._4_4_;
            auVar192._8_4_ = fVar171 + auVar101._8_4_;
            auVar192._12_4_ = fVar171 + auVar101._12_4_;
            auVar192._16_4_ = fVar171 + auVar101._16_4_;
            auVar192._20_4_ = fVar171 + auVar101._20_4_;
            auVar192._24_4_ = fVar171 + auVar101._24_4_;
            auVar192._28_4_ = fVar171 + auVar101._28_4_;
            uVar20 = vcmpps_avx512vl(auVar192,auVar166,2);
            bVar55 = (byte)uVar22 & bVar55 & (byte)uVar20;
            auVar193._8_4_ = 2;
            auVar193._0_8_ = 0x200000002;
            auVar193._12_4_ = 2;
            auVar193._16_4_ = 2;
            auVar193._20_4_ = 2;
            auVar193._24_4_ = 2;
            auVar193._28_4_ = 2;
            auVar35._8_4_ = 3;
            auVar35._0_8_ = 0x300000003;
            auVar35._12_4_ = 3;
            auVar35._16_4_ = 3;
            auVar35._20_4_ = 3;
            auVar35._24_4_ = 3;
            auVar35._28_4_ = 3;
            auVar101 = vpblendmd_avx512vl(auVar193,auVar35);
            auVar138._0_4_ = (uint)(bVar59 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
            bVar67 = (bool)(bVar59 >> 1 & 1);
            auVar138._4_4_ = (uint)bVar67 * auVar101._4_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar59 >> 2 & 1);
            auVar138._8_4_ = (uint)bVar67 * auVar101._8_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar59 >> 3 & 1);
            auVar138._12_4_ = (uint)bVar67 * auVar101._12_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar59 >> 4 & 1);
            auVar138._16_4_ = (uint)bVar67 * auVar101._16_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar59 >> 5 & 1);
            auVar138._20_4_ = (uint)bVar67 * auVar101._20_4_ | (uint)!bVar67 * 2;
            bVar67 = (bool)(bVar59 >> 6 & 1);
            auVar138._24_4_ = (uint)bVar67 * auVar101._24_4_ | (uint)!bVar67 * 2;
            auVar138._28_4_ = (uint)(bVar59 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2
            ;
            uVar20 = vpcmpd_avx512vl(local_4e0,auVar138,5);
            bVar59 = (byte)uVar20 & bVar55;
            if (bVar59 != 0) {
              auVar78 = vminps_avx(local_740._0_16_,local_780._0_16_);
              auVar77 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
              auVar18 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar19 = vminps_avx(auVar78,auVar18);
              auVar78 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
              auVar18 = vmaxps_avx(auVar77,auVar78);
              auVar212._8_4_ = 0x7fffffff;
              auVar212._0_8_ = 0x7fffffff7fffffff;
              auVar212._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx(auVar19,auVar212);
              auVar78 = vandps_avx(auVar18,auVar212);
              auVar77 = vmaxps_avx(auVar77,auVar78);
              auVar78 = vmovshdup_avx(auVar77);
              auVar78 = vmaxss_avx(auVar78,auVar77);
              auVar77 = vshufpd_avx(auVar77,auVar77,1);
              auVar77 = vmaxss_avx(auVar77,auVar78);
              fVar265 = auVar77._0_4_ * 1.9073486e-06;
              local_6c0 = vshufps_avx(auVar18,auVar18,0xff);
              local_540 = fVar171 + local_360._0_4_;
              fStack_53c = fVar171 + local_360._4_4_;
              fStack_538 = fVar171 + local_360._8_4_;
              fStack_534 = fVar171 + local_360._12_4_;
              fStack_530 = fVar171 + local_360._16_4_;
              fStack_52c = fVar171 + local_360._20_4_;
              fStack_528 = fVar171 + local_360._24_4_;
              fStack_524 = fVar171 + local_360._28_4_;
              _local_800 = local_360;
              local_560 = auVar138;
              do {
                auVar167._8_4_ = 0x7f800000;
                auVar167._0_8_ = 0x7f8000007f800000;
                auVar167._12_4_ = 0x7f800000;
                auVar167._16_4_ = 0x7f800000;
                auVar167._20_4_ = 0x7f800000;
                auVar167._24_4_ = 0x7f800000;
                auVar167._28_4_ = 0x7f800000;
                auVar101 = vblendmps_avx512vl(auVar167,auVar196._0_32_);
                auVar139._0_4_ =
                     (uint)(bVar59 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
                bVar67 = (bool)(bVar59 >> 1 & 1);
                auVar139._4_4_ = (uint)bVar67 * auVar101._4_4_ | (uint)!bVar67 * 0x7f800000;
                bVar67 = (bool)(bVar59 >> 2 & 1);
                auVar139._8_4_ = (uint)bVar67 * auVar101._8_4_ | (uint)!bVar67 * 0x7f800000;
                bVar67 = (bool)(bVar59 >> 3 & 1);
                auVar139._12_4_ = (uint)bVar67 * auVar101._12_4_ | (uint)!bVar67 * 0x7f800000;
                bVar67 = (bool)(bVar59 >> 4 & 1);
                auVar139._16_4_ = (uint)bVar67 * auVar101._16_4_ | (uint)!bVar67 * 0x7f800000;
                bVar67 = (bool)(bVar59 >> 5 & 1);
                auVar139._20_4_ = (uint)bVar67 * auVar101._20_4_ | (uint)!bVar67 * 0x7f800000;
                auVar139._24_4_ =
                     (uint)(bVar59 >> 6) * auVar101._24_4_ | (uint)!(bool)(bVar59 >> 6) * 0x7f800000
                ;
                auVar139._28_4_ = 0x7f800000;
                auVar101 = vshufps_avx(auVar139,auVar139,0xb1);
                auVar101 = vminps_avx(auVar139,auVar101);
                auVar98 = vshufpd_avx(auVar101,auVar101,5);
                auVar101 = vminps_avx(auVar101,auVar98);
                auVar98 = vpermpd_avx2(auVar101,0x4e);
                auVar101 = vminps_avx(auVar101,auVar98);
                uVar20 = vcmpps_avx512vl(auVar139,auVar101,0);
                bVar57 = (byte)uVar20 & bVar59;
                bVar64 = bVar59;
                if (bVar57 != 0) {
                  bVar64 = bVar57;
                }
                iVar24 = 0;
                for (uVar70 = (uint)bVar64; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                  iVar24 = iVar24 + 1;
                }
                uVar70 = *(uint *)(local_200 + (uint)(iVar24 << 2));
                uVar69 = *(uint *)(local_340 + (uint)(iVar24 << 2));
                fVar281 = auVar75._0_4_;
                if ((float)local_7c0._0_4_ < 0.0) {
                  fVar281 = sqrtf((float)local_7c0._0_4_);
                }
                auVar77 = vinsertps_avx(ZEXT416(uVar69),ZEXT416(uVar70),0x10);
                auVar285 = ZEXT1664(auVar77);
                bVar67 = true;
                uVar68 = 0;
                do {
                  uVar177 = auVar285._0_4_;
                  auVar159._4_4_ = uVar177;
                  auVar159._0_4_ = uVar177;
                  auVar159._8_4_ = uVar177;
                  auVar159._12_4_ = uVar177;
                  auVar77 = vfmadd132ps_fma(auVar159,ZEXT816(0) << 0x40,local_7b0);
                  local_720 = auVar285._0_32_;
                  auVar78 = vmovshdup_avx(auVar285._0_16_);
                  fVar257 = auVar78._0_4_;
                  fVar297 = 1.0 - fVar257;
                  fVar283 = fVar297 * fVar297 * fVar297;
                  fVar247 = fVar257 * fVar257 * fVar257;
                  auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar283),
                                            ZEXT416((uint)fVar247));
                  fVar282 = fVar257 * fVar297;
                  auVar251 = ZEXT416((uint)fVar297);
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar257 * 6.0)),
                                            ZEXT416((uint)(fVar282 * fVar297)),
                                            SUB6416(ZEXT464(0x41400000),0));
                  auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar247),
                                            ZEXT416((uint)fVar283));
                  auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar297 * 6.0)),
                                            SUB6416(ZEXT464(0x41400000),0),
                                            ZEXT416((uint)(fVar282 * fVar257)));
                  fVar283 = fVar283 * 0.16666667;
                  fVar245 = (auVar18._0_4_ + auVar79._0_4_) * 0.16666667;
                  fVar246 = (auVar19._0_4_ + auVar76._0_4_) * 0.16666667;
                  fVar247 = fVar247 * 0.16666667;
                  auVar213._0_4_ = fVar247 * (float)local_7a0._0_4_;
                  auVar213._4_4_ = fVar247 * (float)local_7a0._4_4_;
                  auVar213._8_4_ = fVar247 * fStack_798;
                  auVar213._12_4_ = fVar247 * fStack_794;
                  auVar253._4_4_ = fVar246;
                  auVar253._0_4_ = fVar246;
                  auVar253._8_4_ = fVar246;
                  auVar253._12_4_ = fVar246;
                  auVar18 = vfmadd132ps_fma(auVar253,auVar213,local_760._0_16_);
                  auVar214._4_4_ = fVar245;
                  auVar214._0_4_ = fVar245;
                  auVar214._8_4_ = fVar245;
                  auVar214._12_4_ = fVar245;
                  auVar18 = vfmadd132ps_fma(auVar214,auVar18,local_780._0_16_);
                  auVar186._4_4_ = fVar283;
                  auVar186._0_4_ = fVar283;
                  auVar186._8_4_ = fVar283;
                  auVar186._12_4_ = fVar283;
                  auVar18 = vfmadd132ps_fma(auVar186,auVar18,local_740._0_16_);
                  local_5e0._0_16_ = auVar18;
                  auVar18 = vsubps_avx(auVar77,auVar18);
                  auVar77 = vdpps_avx(auVar18,auVar18,0x7f);
                  local_7e0._0_16_ = auVar77;
                  if (auVar77._0_4_ < 0.0) {
                    auVar285._0_4_ = sqrtf(auVar77._0_4_);
                    auVar285._4_60_ = extraout_var_00;
                    auVar77 = auVar285._0_16_;
                  }
                  else {
                    auVar77 = vsqrtss_avx(auVar77,auVar77);
                  }
                  local_600._4_4_ = fVar297;
                  local_600._0_4_ = fVar297;
                  fStack_5f8 = fVar297;
                  fStack_5f4 = fVar297;
                  auVar79 = vfnmsub213ss_fma(auVar78,auVar78,ZEXT416((uint)(fVar282 * 4.0)));
                  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * 4.0)),auVar251,auVar251);
                  fVar282 = fVar297 * -fVar297 * 0.5;
                  fVar283 = auVar79._0_4_ * 0.5;
                  fVar245 = auVar19._0_4_ * 0.5;
                  fVar246 = fVar257 * fVar257 * 0.5;
                  auVar237._0_4_ = fVar246 * (float)local_7a0._0_4_;
                  auVar237._4_4_ = fVar246 * (float)local_7a0._4_4_;
                  auVar237._8_4_ = fVar246 * fStack_798;
                  auVar237._12_4_ = fVar246 * fStack_794;
                  auVar187._4_4_ = fVar245;
                  auVar187._0_4_ = fVar245;
                  auVar187._8_4_ = fVar245;
                  auVar187._12_4_ = fVar245;
                  auVar19 = vfmadd132ps_fma(auVar187,auVar237,local_760._0_16_);
                  auVar215._4_4_ = fVar283;
                  auVar215._0_4_ = fVar283;
                  auVar215._8_4_ = fVar283;
                  auVar215._12_4_ = fVar283;
                  auVar19 = vfmadd132ps_fma(auVar215,auVar19,local_780._0_16_);
                  auVar291._4_4_ = fVar282;
                  auVar291._0_4_ = fVar282;
                  auVar291._8_4_ = fVar282;
                  auVar291._12_4_ = fVar282;
                  auVar19 = vfmadd132ps_fma(auVar291,auVar19,local_740._0_16_);
                  local_620._0_16_ = vdpps_avx(auVar19,auVar19,0x7f);
                  auVar51._12_4_ = 0;
                  auVar51._0_12_ = ZEXT812(0);
                  fVar282 = local_620._0_4_;
                  auVar79 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar282));
                  fVar283 = auVar79._0_4_;
                  local_640._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar282));
                  auVar79 = vfnmadd213ss_fma(local_640._0_16_,local_620._0_16_,ZEXT416(0x40000000));
                  local_660._0_4_ = auVar79._0_4_;
                  uVar70 = auVar77._0_4_;
                  if (fVar282 < -fVar282) {
                    fVar245 = sqrtf(fVar282);
                    auVar77 = ZEXT416(uVar70);
                  }
                  else {
                    auVar79 = vsqrtss_avx(local_620._0_16_,local_620._0_16_);
                    fVar245 = auVar79._0_4_;
                  }
                  auVar82 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(fVar283 * 1.5 +
                                                     fVar282 * -0.5 * fVar283 * fVar283 * fVar283)))
                  ;
                  auVar81 = vmulps_avx512vl(auVar19,auVar82);
                  auVar79 = vdpps_avx(auVar18,auVar81,0x7f);
                  fVar246 = auVar77._0_4_;
                  fVar282 = auVar79._0_4_;
                  auVar160._0_4_ = fVar282 * fVar282;
                  auVar160._4_4_ = auVar79._4_4_ * auVar79._4_4_;
                  auVar160._8_4_ = auVar79._8_4_ * auVar79._8_4_;
                  auVar160._12_4_ = auVar79._12_4_ * auVar79._12_4_;
                  auVar76 = vsubps_avx(local_7e0._0_16_,auVar160);
                  fVar283 = auVar76._0_4_;
                  auVar188._4_12_ = ZEXT812(0) << 0x20;
                  auVar188._0_4_ = fVar283;
                  auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
                  auVar84 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
                  auVar83 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
                  if (fVar283 < 0.0) {
                    local_690._0_4_ = auVar84._0_4_;
                    _local_6b0 = auVar82;
                    local_6a0 = auVar81;
                    local_680 = auVar80;
                    fVar283 = sqrtf(fVar283);
                    auVar83 = ZEXT416(auVar83._0_4_);
                    auVar84 = ZEXT416((uint)local_690._0_4_);
                    auVar77 = ZEXT416(uVar70);
                    auVar80 = local_680;
                    auVar81 = local_6a0;
                    auVar82 = _local_6b0;
                  }
                  else {
                    auVar76 = vsqrtss_avx(auVar76,auVar76);
                    fVar283 = auVar76._0_4_;
                  }
                  auVar293 = ZEXT1664(auVar19);
                  auVar288 = ZEXT1664(local_7e0._0_16_);
                  auVar286 = ZEXT1664(auVar18);
                  auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar251,auVar78);
                  auVar251 = vfmadd213ss_fma(auVar78,SUB6416(ZEXT464(0xc0000000),0),auVar251);
                  auVar284 = local_720._0_16_;
                  auVar78 = vshufps_avx(auVar284,auVar284,0x55);
                  auVar216._0_4_ = auVar78._0_4_ * (float)local_7a0._0_4_;
                  auVar216._4_4_ = auVar78._4_4_ * (float)local_7a0._4_4_;
                  auVar216._8_4_ = auVar78._8_4_ * fStack_798;
                  auVar216._12_4_ = auVar78._12_4_ * fStack_794;
                  auVar238._0_4_ = auVar251._0_4_;
                  auVar238._4_4_ = auVar238._0_4_;
                  auVar238._8_4_ = auVar238._0_4_;
                  auVar238._12_4_ = auVar238._0_4_;
                  auVar78 = vfmadd132ps_fma(auVar238,auVar216,local_760._0_16_);
                  auVar189._0_4_ = auVar76._0_4_;
                  auVar189._4_4_ = auVar189._0_4_;
                  auVar189._8_4_ = auVar189._0_4_;
                  auVar189._12_4_ = auVar189._0_4_;
                  auVar78 = vfmadd132ps_fma(auVar189,auVar78,local_780._0_16_);
                  auVar78 = vfmadd132ps_fma(_local_600,auVar78,local_740._0_16_);
                  auVar190._0_4_ = auVar78._0_4_ * (float)local_620._0_4_;
                  auVar190._4_4_ = auVar78._4_4_ * (float)local_620._0_4_;
                  auVar190._8_4_ = auVar78._8_4_ * (float)local_620._0_4_;
                  auVar190._12_4_ = auVar78._12_4_ * (float)local_620._0_4_;
                  auVar78 = vdpps_avx(auVar19,auVar78,0x7f);
                  fVar247 = auVar78._0_4_;
                  auVar217._0_4_ = auVar19._0_4_ * fVar247;
                  auVar217._4_4_ = auVar19._4_4_ * fVar247;
                  auVar217._8_4_ = auVar19._8_4_ * fVar247;
                  auVar217._12_4_ = auVar19._12_4_ * fVar247;
                  auVar78 = vsubps_avx(auVar190,auVar217);
                  fVar247 = (float)local_660._0_4_ * (float)local_640._0_4_;
                  auVar251 = vmaxss_avx(ZEXT416((uint)fVar265),
                                        ZEXT416((uint)(local_720._0_4_ * fVar281 * 1.9073486e-06)));
                  auVar218._0_4_ = auVar78._0_4_ * fVar247;
                  auVar218._4_4_ = auVar78._4_4_ * fVar247;
                  auVar218._8_4_ = auVar78._8_4_ * fVar247;
                  auVar218._12_4_ = auVar78._12_4_ * fVar247;
                  auVar29._8_4_ = 0x80000000;
                  auVar29._0_8_ = 0x8000000080000000;
                  auVar29._12_4_ = 0x80000000;
                  auVar85 = vxorps_avx512vl(auVar19,auVar29);
                  auVar82 = vmulps_avx512vl(auVar82,auVar218);
                  auVar78 = vdpps_avx(auVar85,auVar81,0x7f);
                  auVar76 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar265),auVar251);
                  auVar77 = vdpps_avx(auVar18,auVar82,0x7f);
                  auVar82 = vfmadd213ss_fma(ZEXT416((uint)(fVar246 + 1.0)),
                                            ZEXT416((uint)(fVar265 / fVar245)),auVar76);
                  fVar245 = auVar78._0_4_ + auVar77._0_4_;
                  auVar77 = vdpps_avx(local_7b0,auVar81,0x7f);
                  auVar78 = vdpps_avx(auVar18,auVar85,0x7f);
                  auVar76 = vmulss_avx512f(auVar83,auVar80);
                  auVar84 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar76._0_4_ *
                                                                 auVar80._0_4_ * auVar80._0_4_)));
                  auVar76 = vdpps_avx(auVar18,local_7b0,0x7f);
                  auVar81 = vfnmadd231ss_fma(auVar78,auVar79,ZEXT416((uint)fVar245));
                  auVar76 = vfnmadd231ss_fma(auVar76,auVar79,auVar77);
                  auVar78 = vpermilps_avx(local_5e0._0_16_,0xff);
                  fVar283 = fVar283 - auVar78._0_4_;
                  auVar80 = vshufps_avx(auVar19,auVar19,0xff);
                  auVar78 = vfmsub213ss_fma(auVar81,auVar84,auVar80);
                  auVar279._8_4_ = 0x80000000;
                  auVar279._0_8_ = 0x8000000080000000;
                  auVar279._12_4_ = 0x80000000;
                  auVar280 = ZEXT1664(auVar279);
                  auVar274._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
                  auVar274._8_4_ = auVar78._8_4_ ^ 0x80000000;
                  auVar274._12_4_ = auVar78._12_4_ ^ 0x80000000;
                  auVar276 = ZEXT1664(auVar274);
                  auVar76 = ZEXT416((uint)(auVar76._0_4_ * auVar84._0_4_));
                  auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar78._0_4_)),
                                            ZEXT416((uint)fVar245),auVar76);
                  auVar78 = vinsertps_avx(auVar274,auVar76,0x1c);
                  auVar263._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                  auVar263._8_4_ = auVar77._8_4_ ^ 0x80000000;
                  auVar263._12_4_ = auVar77._12_4_ ^ 0x80000000;
                  auVar76 = vinsertps_avx(ZEXT416((uint)fVar245),auVar263,0x10);
                  auVar239._0_4_ = auVar81._0_4_;
                  auVar239._4_4_ = auVar239._0_4_;
                  auVar239._8_4_ = auVar239._0_4_;
                  auVar239._12_4_ = auVar239._0_4_;
                  auVar77 = vdivps_avx(auVar78,auVar239);
                  auVar78 = vdivps_avx(auVar76,auVar239);
                  auVar240._0_4_ = fVar282 * auVar77._0_4_ + fVar283 * auVar78._0_4_;
                  auVar240._4_4_ = fVar282 * auVar77._4_4_ + fVar283 * auVar78._4_4_;
                  auVar240._8_4_ = fVar282 * auVar77._8_4_ + fVar283 * auVar78._8_4_;
                  auVar240._12_4_ = fVar282 * auVar77._12_4_ + fVar283 * auVar78._12_4_;
                  auVar77 = vsubps_avx(auVar284,auVar240);
                  auVar285 = ZEXT1664(auVar77);
                  auVar30._8_4_ = 0x7fffffff;
                  auVar30._0_8_ = 0x7fffffff7fffffff;
                  auVar30._12_4_ = 0x7fffffff;
                  auVar78 = vandps_avx512vl(auVar79,auVar30);
                  if (auVar78._0_4_ < auVar82._0_4_) {
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ + auVar251._0_4_)),
                                              local_6c0,ZEXT416(0x36000000));
                    auVar31._8_4_ = 0x7fffffff;
                    auVar31._0_8_ = 0x7fffffff7fffffff;
                    auVar31._12_4_ = 0x7fffffff;
                    auVar79 = vandps_avx512vl(ZEXT416((uint)fVar283),auVar31);
                    if (auVar79._0_4_ < auVar78._0_4_) {
                      fVar281 = auVar77._0_4_ + (float)local_6d0._0_4_;
                      if (fVar281 < fVar169) {
                        bVar64 = 0;
                        goto LAB_01ba9699;
                      }
                      fVar282 = *(float *)(ray + k * 4 + 0x100);
                      auVar276 = ZEXT464((uint)fVar282);
                      auVar196 = ZEXT3264(_local_800);
                      if (fVar281 <= fVar282) {
                        auVar78 = vmovshdup_avx(auVar77);
                        bVar64 = 0;
                        if ((auVar78._0_4_ < 0.0) || (1.0 < auVar78._0_4_)) goto LAB_01ba96a2;
                        auVar241._0_12_ = ZEXT812(0);
                        auVar241._12_4_ = 0;
                        auVar219._4_8_ = auVar241._4_8_;
                        auVar219._0_4_ = local_7e0._0_4_;
                        auVar219._12_4_ = 0;
                        auVar78 = vrsqrt14ss_avx512f(auVar241,auVar219);
                        fVar283 = auVar78._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar61].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                          bVar64 = 0;
                          goto LAB_01ba96a2;
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar64 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01ba96a2;
                        fVar283 = fVar283 * 1.5 +
                                  local_7e0._0_4_ * -0.5 * fVar283 * fVar283 * fVar283;
                        auVar220._0_4_ = auVar18._0_4_ * fVar283;
                        auVar220._4_4_ = auVar18._4_4_ * fVar283;
                        auVar220._8_4_ = auVar18._8_4_ * fVar283;
                        auVar220._12_4_ = auVar18._12_4_ * fVar283;
                        auVar251 = vfmadd213ps_fma(auVar80,auVar220,auVar19);
                        auVar78 = vshufps_avx(auVar220,auVar220,0xc9);
                        auVar79 = vshufps_avx(auVar19,auVar19,0xc9);
                        auVar221._0_4_ = auVar220._0_4_ * auVar79._0_4_;
                        auVar221._4_4_ = auVar220._4_4_ * auVar79._4_4_;
                        auVar221._8_4_ = auVar220._8_4_ * auVar79._8_4_;
                        auVar221._12_4_ = auVar220._12_4_ * auVar79._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar221,auVar19,auVar78);
                        auVar78 = vshufps_avx(auVar76,auVar76,0xc9);
                        auVar79 = vshufps_avx(auVar251,auVar251,0xc9);
                        auVar76 = vshufps_avx(auVar76,auVar76,0xd2);
                        auVar161._0_4_ = auVar251._0_4_ * auVar76._0_4_;
                        auVar161._4_4_ = auVar251._4_4_ * auVar76._4_4_;
                        auVar161._8_4_ = auVar251._8_4_ * auVar76._8_4_;
                        auVar161._12_4_ = auVar251._12_4_ * auVar76._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar161,auVar78,auVar79);
                        auVar244._8_4_ = 1;
                        auVar244._0_8_ = 0x100000001;
                        auVar244._12_4_ = 1;
                        auVar244._16_4_ = 1;
                        auVar244._20_4_ = 1;
                        auVar244._24_4_ = 1;
                        auVar244._28_4_ = 1;
                        local_420 = vpermps_avx2(auVar244,ZEXT1632(auVar77));
                        auVar101 = vpermps_avx2(auVar244,ZEXT1632(auVar78));
                        auVar256._8_4_ = 2;
                        auVar256._0_8_ = 0x200000002;
                        auVar256._12_4_ = 2;
                        auVar256._16_4_ = 2;
                        auVar256._20_4_ = 2;
                        auVar256._24_4_ = 2;
                        auVar256._28_4_ = 2;
                        local_460 = vpermps_avx2(auVar256,ZEXT1632(auVar78));
                        local_440 = auVar78._0_4_;
                        local_480[0] = (RTCHitN)auVar101[0];
                        local_480[1] = (RTCHitN)auVar101[1];
                        local_480[2] = (RTCHitN)auVar101[2];
                        local_480[3] = (RTCHitN)auVar101[3];
                        local_480[4] = (RTCHitN)auVar101[4];
                        local_480[5] = (RTCHitN)auVar101[5];
                        local_480[6] = (RTCHitN)auVar101[6];
                        local_480[7] = (RTCHitN)auVar101[7];
                        local_480[8] = (RTCHitN)auVar101[8];
                        local_480[9] = (RTCHitN)auVar101[9];
                        local_480[10] = (RTCHitN)auVar101[10];
                        local_480[0xb] = (RTCHitN)auVar101[0xb];
                        local_480[0xc] = (RTCHitN)auVar101[0xc];
                        local_480[0xd] = (RTCHitN)auVar101[0xd];
                        local_480[0xe] = (RTCHitN)auVar101[0xe];
                        local_480[0xf] = (RTCHitN)auVar101[0xf];
                        local_480[0x10] = (RTCHitN)auVar101[0x10];
                        local_480[0x11] = (RTCHitN)auVar101[0x11];
                        local_480[0x12] = (RTCHitN)auVar101[0x12];
                        local_480[0x13] = (RTCHitN)auVar101[0x13];
                        local_480[0x14] = (RTCHitN)auVar101[0x14];
                        local_480[0x15] = (RTCHitN)auVar101[0x15];
                        local_480[0x16] = (RTCHitN)auVar101[0x16];
                        local_480[0x17] = (RTCHitN)auVar101[0x17];
                        local_480[0x18] = (RTCHitN)auVar101[0x18];
                        local_480[0x19] = (RTCHitN)auVar101[0x19];
                        local_480[0x1a] = (RTCHitN)auVar101[0x1a];
                        local_480[0x1b] = (RTCHitN)auVar101[0x1b];
                        local_480[0x1c] = (RTCHitN)auVar101[0x1c];
                        local_480[0x1d] = (RTCHitN)auVar101[0x1d];
                        local_480[0x1e] = (RTCHitN)auVar101[0x1e];
                        local_480[0x1f] = (RTCHitN)auVar101[0x1f];
                        uStack_43c = local_440;
                        uStack_438 = local_440;
                        uStack_434 = local_440;
                        uStack_430 = local_440;
                        uStack_42c = local_440;
                        uStack_428 = local_440;
                        uStack_424 = local_440;
                        local_400 = ZEXT432(0) << 0x20;
                        local_3e0 = local_4a0._0_8_;
                        uStack_3d8 = local_4a0._8_8_;
                        uStack_3d0 = local_4a0._16_8_;
                        uStack_3c8 = local_4a0._24_8_;
                        local_3c0 = local_4c0;
                        vpcmpeqd_avx2(local_4c0,local_4c0);
                        local_3a0 = context->user->instID[0];
                        uStack_39c = local_3a0;
                        uStack_398 = local_3a0;
                        uStack_394 = local_3a0;
                        uStack_390 = local_3a0;
                        uStack_38c = local_3a0;
                        uStack_388 = local_3a0;
                        uStack_384 = local_3a0;
                        local_380 = context->user->instPrimID[0];
                        uStack_37c = local_380;
                        uStack_378 = local_380;
                        uStack_374 = local_380;
                        uStack_370 = local_380;
                        uStack_36c = local_380;
                        uStack_368 = local_380;
                        uStack_364 = local_380;
                        *(float *)(ray + k * 4 + 0x100) = fVar281;
                        local_700 = local_500;
                        local_830.valid = (int *)local_700;
                        local_830.geometryUserPtr = pGVar3->userPtr;
                        local_830.context = context->user;
                        local_830.hit = local_480;
                        local_830.N = 8;
                        local_830.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar280 = ZEXT1664(auVar279);
                          auVar285 = ZEXT1664(auVar77);
                          auVar286 = ZEXT1664(auVar18);
                          auVar288 = ZEXT1664(local_7e0._0_16_);
                          auVar293 = ZEXT1664(auVar19);
                          (*pGVar3->occlusionFilterN)(&local_830);
                          auVar196 = ZEXT3264(_local_800);
                        }
                        if (local_700 != (undefined1  [32])0x0) {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar280 = ZEXT1664(auVar280._0_16_);
                            auVar285 = ZEXT1664(auVar285._0_16_);
                            auVar286 = ZEXT1664(auVar286._0_16_);
                            auVar288 = ZEXT1664(auVar288._0_16_);
                            auVar293 = ZEXT1664(auVar293._0_16_);
                            (*p_Var7)(&local_830);
                            auVar196 = ZEXT3264(_local_800);
                          }
                          auVar276 = ZEXT464((uint)fVar282);
                          uVar68 = vptestmd_avx512vl(local_700,local_700);
                          auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar8 = (bool)((byte)uVar68 & 1);
                          auVar140._0_4_ =
                               (uint)bVar8 * auVar101._0_4_ |
                               (uint)!bVar8 * *(int *)(local_830.ray + 0x100);
                          bVar8 = (bool)((byte)(uVar68 >> 1) & 1);
                          auVar140._4_4_ =
                               (uint)bVar8 * auVar101._4_4_ |
                               (uint)!bVar8 * *(int *)(local_830.ray + 0x104);
                          bVar8 = (bool)((byte)(uVar68 >> 2) & 1);
                          auVar140._8_4_ =
                               (uint)bVar8 * auVar101._8_4_ |
                               (uint)!bVar8 * *(int *)(local_830.ray + 0x108);
                          bVar8 = (bool)((byte)(uVar68 >> 3) & 1);
                          auVar140._12_4_ =
                               (uint)bVar8 * auVar101._12_4_ |
                               (uint)!bVar8 * *(int *)(local_830.ray + 0x10c);
                          bVar8 = (bool)((byte)(uVar68 >> 4) & 1);
                          auVar140._16_4_ =
                               (uint)bVar8 * auVar101._16_4_ |
                               (uint)!bVar8 * *(int *)(local_830.ray + 0x110);
                          bVar8 = (bool)((byte)(uVar68 >> 5) & 1);
                          auVar140._20_4_ =
                               (uint)bVar8 * auVar101._20_4_ |
                               (uint)!bVar8 * *(int *)(local_830.ray + 0x114);
                          bVar8 = (bool)((byte)(uVar68 >> 6) & 1);
                          auVar140._24_4_ =
                               (uint)bVar8 * auVar101._24_4_ |
                               (uint)!bVar8 * *(int *)(local_830.ray + 0x118);
                          bVar8 = SUB81(uVar68 >> 7,0);
                          auVar140._28_4_ =
                               (uint)bVar8 * auVar101._28_4_ |
                               (uint)!bVar8 * *(int *)(local_830.ray + 0x11c);
                          *(undefined1 (*) [32])(local_830.ray + 0x100) = auVar140;
                          bVar64 = 1;
                          if (local_700 != (undefined1  [32])0x0) goto LAB_01ba96a2;
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar282;
                      }
                      auVar276 = ZEXT464((uint)fVar282);
                      bVar64 = 0;
                      goto LAB_01ba96a2;
                    }
                  }
                  bVar67 = uVar68 < 4;
                  uVar68 = uVar68 + 1;
                } while (uVar68 != 5);
                bVar67 = false;
                bVar64 = 5;
LAB_01ba9699:
                auVar196 = ZEXT3264(_local_800);
LAB_01ba96a2:
                bVar65 = (bool)(bVar65 | bVar67 & bVar64);
                uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar166._4_4_ = uVar177;
                auVar166._0_4_ = uVar177;
                auVar166._8_4_ = uVar177;
                auVar166._12_4_ = uVar177;
                auVar166._16_4_ = uVar177;
                auVar166._20_4_ = uVar177;
                auVar166._24_4_ = uVar177;
                auVar166._28_4_ = uVar177;
                auVar53._4_4_ = fStack_53c;
                auVar53._0_4_ = local_540;
                auVar53._8_4_ = fStack_538;
                auVar53._12_4_ = fStack_534;
                auVar53._16_4_ = fStack_530;
                auVar53._20_4_ = fStack_52c;
                auVar53._24_4_ = fStack_528;
                auVar53._28_4_ = fStack_524;
                uVar20 = vcmpps_avx512vl(auVar166,auVar53,0xd);
                bVar59 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar59 & (byte)uVar20;
                auVar138 = local_560;
              } while (bVar59 != 0);
            }
            uVar22 = vpcmpgtd_avx512vl(auVar138,local_4e0);
            uVar23 = vpcmpd_avx512vl(local_4e0,local_300,1);
            auVar223._0_4_ = fVar171 + (float)local_1c0._0_4_;
            auVar223._4_4_ = fVar171 + (float)local_1c0._4_4_;
            auVar223._8_4_ = fVar171 + fStack_1b8;
            auVar223._12_4_ = fVar171 + fStack_1b4;
            auVar223._16_4_ = fVar171 + fStack_1b0;
            auVar223._20_4_ = fVar171 + fStack_1ac;
            auVar223._24_4_ = fVar171 + fStack_1a8;
            auVar223._28_4_ = fVar171 + fStack_1a4;
            uVar20 = vcmpps_avx512vl(auVar223,auVar166,2);
            bVar60 = bVar60 & (byte)uVar23 & (byte)uVar20;
            auVar224._0_4_ = fVar171 + local_360._0_4_;
            auVar224._4_4_ = fVar171 + local_360._4_4_;
            auVar224._8_4_ = fVar171 + local_360._8_4_;
            auVar224._12_4_ = fVar171 + local_360._12_4_;
            auVar224._16_4_ = fVar171 + local_360._16_4_;
            auVar224._20_4_ = fVar171 + local_360._20_4_;
            auVar224._24_4_ = fVar171 + local_360._24_4_;
            auVar224._28_4_ = fVar171 + local_360._28_4_;
            uVar20 = vcmpps_avx512vl(auVar224,auVar166,2);
            bVar55 = bVar55 & (byte)uVar22 & (byte)uVar20 | bVar60;
            if (bVar55 != 0) {
              abStack_180[uVar62 * 0x60] = bVar55;
              auVar141._0_4_ =
                   (uint)(bVar60 & 1) * local_1c0._0_4_ |
                   (uint)!(bool)(bVar60 & 1) * (int)local_360._0_4_;
              bVar67 = (bool)(bVar60 >> 1 & 1);
              auVar141._4_4_ = (uint)bVar67 * local_1c0._4_4_ | (uint)!bVar67 * (int)local_360._4_4_
              ;
              bVar67 = (bool)(bVar60 >> 2 & 1);
              auVar141._8_4_ = (uint)bVar67 * (int)fStack_1b8 | (uint)!bVar67 * (int)local_360._8_4_
              ;
              bVar67 = (bool)(bVar60 >> 3 & 1);
              auVar141._12_4_ =
                   (uint)bVar67 * (int)fStack_1b4 | (uint)!bVar67 * (int)local_360._12_4_;
              bVar67 = (bool)(bVar60 >> 4 & 1);
              auVar141._16_4_ =
                   (uint)bVar67 * (int)fStack_1b0 | (uint)!bVar67 * (int)local_360._16_4_;
              bVar67 = (bool)(bVar60 >> 5 & 1);
              auVar141._20_4_ =
                   (uint)bVar67 * (int)fStack_1ac | (uint)!bVar67 * (int)local_360._20_4_;
              auVar141._24_4_ =
                   (uint)(bVar60 >> 6) * (int)fStack_1a8 |
                   (uint)!(bool)(bVar60 >> 6) * (int)local_360._24_4_;
              auVar141._28_4_ = local_360._28_4_;
              *(undefined1 (*) [32])(auStack_160 + uVar62 * 0x60) = auVar141;
              uVar68 = vmovlps_avx(local_510);
              (&uStack_140)[uVar62 * 0xc] = uVar68;
              aiStack_138[uVar62 * 0x18] = iVar63 + 1;
              uVar62 = (ulong)((int)uVar62 + 1);
            }
          }
        }
      }
    }
    do {
      uVar70 = (uint)uVar62;
      uVar62 = (ulong)(uVar70 - 1);
      if (uVar70 == 0) {
        if (bVar65 != false) {
          return bVar65;
        }
        uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar32._4_4_ = uVar177;
        auVar32._0_4_ = uVar177;
        auVar32._8_4_ = uVar177;
        auVar32._12_4_ = uVar177;
        uVar20 = vcmpps_avx512vl(local_520,auVar32,2);
        uVar61 = (uint)uVar20 & (uint)local_668 - 1 & (uint)local_668;
        local_668 = (ulong)uVar61;
        if (uVar61 == 0) {
          return false;
        }
        goto LAB_01ba7281;
      }
      lVar58 = uVar62 * 0x60;
      auVar101 = *(undefined1 (*) [32])(auStack_160 + lVar58);
      auVar194._0_4_ = fVar171 + auVar101._0_4_;
      auVar194._4_4_ = fVar171 + auVar101._4_4_;
      auVar194._8_4_ = fVar171 + auVar101._8_4_;
      auVar194._12_4_ = fVar171 + auVar101._12_4_;
      auVar194._16_4_ = fVar171 + auVar101._16_4_;
      auVar194._20_4_ = fVar171 + auVar101._20_4_;
      auVar194._24_4_ = fVar171 + auVar101._24_4_;
      auVar194._28_4_ = fVar171 + auVar101._28_4_;
      uVar177 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar177;
      auVar36._0_4_ = uVar177;
      auVar36._8_4_ = uVar177;
      auVar36._12_4_ = uVar177;
      auVar36._16_4_ = uVar177;
      auVar36._20_4_ = uVar177;
      auVar36._24_4_ = uVar177;
      auVar36._28_4_ = uVar177;
      uVar20 = vcmpps_avx512vl(auVar194,auVar36,2);
      uVar69 = (uint)uVar20 & (uint)abStack_180[lVar58];
    } while (uVar69 == 0);
    uVar68 = (&uStack_140)[uVar62 * 0xc];
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar68;
    auVar225._8_4_ = 0x7f800000;
    auVar225._0_8_ = 0x7f8000007f800000;
    auVar225._12_4_ = 0x7f800000;
    auVar225._16_4_ = 0x7f800000;
    auVar225._20_4_ = 0x7f800000;
    auVar225._24_4_ = 0x7f800000;
    auVar225._28_4_ = 0x7f800000;
    auVar98 = vblendmps_avx512vl(auVar225,auVar101);
    bVar55 = (byte)uVar69;
    auVar142._0_4_ =
         (uint)(bVar55 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)auVar101._0_4_;
    bVar67 = (bool)((byte)(uVar69 >> 1) & 1);
    auVar142._4_4_ = (uint)bVar67 * auVar98._4_4_ | (uint)!bVar67 * (int)auVar101._4_4_;
    bVar67 = (bool)((byte)(uVar69 >> 2) & 1);
    auVar142._8_4_ = (uint)bVar67 * auVar98._8_4_ | (uint)!bVar67 * (int)auVar101._8_4_;
    bVar67 = (bool)((byte)(uVar69 >> 3) & 1);
    auVar142._12_4_ = (uint)bVar67 * auVar98._12_4_ | (uint)!bVar67 * (int)auVar101._12_4_;
    bVar67 = (bool)((byte)(uVar69 >> 4) & 1);
    auVar142._16_4_ = (uint)bVar67 * auVar98._16_4_ | (uint)!bVar67 * (int)auVar101._16_4_;
    bVar67 = (bool)((byte)(uVar69 >> 5) & 1);
    auVar142._20_4_ = (uint)bVar67 * auVar98._20_4_ | (uint)!bVar67 * (int)auVar101._20_4_;
    bVar67 = (bool)((byte)(uVar69 >> 6) & 1);
    auVar142._24_4_ = (uint)bVar67 * auVar98._24_4_ | (uint)!bVar67 * (int)auVar101._24_4_;
    auVar142._28_4_ =
         (uVar69 >> 7) * auVar98._28_4_ | (uint)!SUB41(uVar69 >> 7,0) * (int)auVar101._28_4_;
    auVar101 = vshufps_avx(auVar142,auVar142,0xb1);
    auVar101 = vminps_avx(auVar142,auVar101);
    auVar98 = vshufpd_avx(auVar101,auVar101,5);
    auVar101 = vminps_avx(auVar101,auVar98);
    auVar98 = vpermpd_avx2(auVar101,0x4e);
    auVar101 = vminps_avx(auVar101,auVar98);
    uVar20 = vcmpps_avx512vl(auVar142,auVar101,0);
    bVar59 = (byte)uVar20 & bVar55;
    if (bVar59 != 0) {
      uVar69 = (uint)bVar59;
    }
    uVar143 = 0;
    for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
      uVar143 = uVar143 + 1;
    }
    iVar63 = aiStack_138[uVar62 * 0x18];
    bVar55 = ~('\x01' << ((byte)uVar143 & 0x1f)) & bVar55;
    abStack_180[lVar58] = bVar55;
    if (bVar55 == 0) {
      uVar70 = uVar70 - 1;
    }
    uVar177 = (undefined4)uVar68;
    auVar168._4_4_ = uVar177;
    auVar168._0_4_ = uVar177;
    auVar168._8_4_ = uVar177;
    auVar168._12_4_ = uVar177;
    auVar168._16_4_ = uVar177;
    auVar168._20_4_ = uVar177;
    auVar168._24_4_ = uVar177;
    auVar168._28_4_ = uVar177;
    auVar77 = vmovshdup_avx(auVar191);
    auVar77 = vsubps_avx(auVar77,auVar191);
    auVar195._0_4_ = auVar77._0_4_;
    auVar195._4_4_ = auVar195._0_4_;
    auVar195._8_4_ = auVar195._0_4_;
    auVar195._12_4_ = auVar195._0_4_;
    auVar195._16_4_ = auVar195._0_4_;
    auVar195._20_4_ = auVar195._0_4_;
    auVar195._24_4_ = auVar195._0_4_;
    auVar195._28_4_ = auVar195._0_4_;
    auVar77 = vfmadd132ps_fma(auVar195,auVar168,_DAT_01faff20);
    auVar101 = ZEXT1632(auVar77);
    local_480[0] = (RTCHitN)auVar101[0];
    local_480[1] = (RTCHitN)auVar101[1];
    local_480[2] = (RTCHitN)auVar101[2];
    local_480[3] = (RTCHitN)auVar101[3];
    local_480[4] = (RTCHitN)auVar101[4];
    local_480[5] = (RTCHitN)auVar101[5];
    local_480[6] = (RTCHitN)auVar101[6];
    local_480[7] = (RTCHitN)auVar101[7];
    local_480[8] = (RTCHitN)auVar101[8];
    local_480[9] = (RTCHitN)auVar101[9];
    local_480[10] = (RTCHitN)auVar101[10];
    local_480[0xb] = (RTCHitN)auVar101[0xb];
    local_480[0xc] = (RTCHitN)auVar101[0xc];
    local_480[0xd] = (RTCHitN)auVar101[0xd];
    local_480[0xe] = (RTCHitN)auVar101[0xe];
    local_480[0xf] = (RTCHitN)auVar101[0xf];
    local_480[0x10] = (RTCHitN)auVar101[0x10];
    local_480[0x11] = (RTCHitN)auVar101[0x11];
    local_480[0x12] = (RTCHitN)auVar101[0x12];
    local_480[0x13] = (RTCHitN)auVar101[0x13];
    local_480[0x14] = (RTCHitN)auVar101[0x14];
    local_480[0x15] = (RTCHitN)auVar101[0x15];
    local_480[0x16] = (RTCHitN)auVar101[0x16];
    local_480[0x17] = (RTCHitN)auVar101[0x17];
    local_480[0x18] = (RTCHitN)auVar101[0x18];
    local_480[0x19] = (RTCHitN)auVar101[0x19];
    local_480[0x1a] = (RTCHitN)auVar101[0x1a];
    local_480[0x1b] = (RTCHitN)auVar101[0x1b];
    local_480[0x1c] = (RTCHitN)auVar101[0x1c];
    local_480[0x1d] = (RTCHitN)auVar101[0x1d];
    local_480[0x1e] = (RTCHitN)auVar101[0x1e];
    local_480[0x1f] = (RTCHitN)auVar101[0x1f];
    auVar196 = ZEXT864(*(ulong *)(local_480 + (ulong)uVar143 * 4));
    uVar62 = (ulong)uVar70;
    fVar265 = fVar171;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }